

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  uint *puVar1;
  undefined4 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  stbtt__point sVar6;
  stbtt__point sVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  stbtt_uint8 sVar11;
  ImWchar IVar12;
  ImFont *pIVar13;
  ImFont **ppIVar14;
  stbtt_uint8 *data;
  undefined8 *puVar15;
  char cVar16;
  char cVar22;
  short sVar30;
  stbrp_node *psVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  stbtt__buf fontdict;
  undefined1 auVar34 [14];
  undefined1 auVar35 [12];
  unkuint10 Var36;
  undefined1 auVar37 [12];
  undefined1 auVar38 [16];
  unkbyte10 Var39;
  undefined1 auVar40 [13];
  undefined1 auVar41 [11];
  undefined1 auVar42 [15];
  undefined1 auVar43 [14];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  uint6 uVar49;
  ushort uVar50;
  stbtt_uint32 sVar51;
  uint uVar58;
  int iVar59;
  int iVar60;
  stbtt__active_edge *z;
  stbtt_uint32 sVar52;
  stbtt_uint32 sVar53;
  stbtt_uint32 sVar54;
  stbtt_uint32 sVar55;
  stbtt_uint32 sVar56;
  stbtt_uint32 sVar57;
  void *__dest;
  void *pvVar61;
  ulong uVar62;
  undefined4 extraout_var;
  uchar *puVar63;
  int *piVar64;
  void *pvVar65;
  long lVar66;
  stbrp_context *ptr;
  uchar *puVar67;
  stbtt__point *points;
  stbtt__edge *psVar68;
  stbtt__buf *scanline;
  stbtt__active_edge *psVar69;
  stbtt__buf *psVar70;
  undefined8 *puVar71;
  int iVar72;
  long lVar73;
  ImWchar *pIVar74;
  ushort *puVar75;
  uint *puVar76;
  stbtt__active_edge *psVar77;
  stbtt__active_edge *psVar78;
  int iVar79;
  long lVar80;
  ulong uVar81;
  stbtt_fontinfo *psVar82;
  stbtt__active_edge *psVar83;
  byte *pbVar84;
  ImU32 bit_n;
  uchar uVar85;
  int output_i;
  ulong uVar86;
  stbtt__edge *psVar87;
  ulong uVar88;
  size_t size;
  byte *pbVar89;
  long lVar90;
  ImFontConfig *pIVar91;
  int iVar92;
  void *p;
  int iVar93;
  void *pvVar94;
  ImU32 mask;
  uint uVar95;
  bool bVar96;
  bool bVar97;
  byte bVar98;
  byte bVar104;
  char cVar105;
  float fVar99;
  float fVar100;
  ushort uVar107;
  undefined1 auVar101 [16];
  char cVar106;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar111;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar119;
  uint uVar120;
  float fVar121;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar122;
  uint uVar126;
  uint uVar128;
  undefined1 auVar123 [16];
  float fVar127;
  float fVar129;
  uint uVar130;
  float fVar131;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  short sVar132;
  float fVar133;
  uint uVar142;
  uint uVar144;
  undefined1 auVar139 [16];
  float fVar143;
  float fVar145;
  uint uVar146;
  float fVar147;
  undefined1 auVar140 [16];
  float fVar148;
  uint uVar153;
  uint uVar155;
  undefined1 auVar149 [16];
  float fVar154;
  float fVar156;
  uint uVar157;
  float fVar158;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  short sVar159;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  stbtt__buf sVar176;
  float y0_2;
  ImVector<ImFontBuildSrcData> src_tmp_array;
  int y1;
  stbtt_uint32 charstrings;
  ImVector<stbrp_rect> buf_rects;
  ImVector<ImFontBuildDstData> dst_tmp_array;
  ImVector<stbtt_packedchar> buf_packedchars;
  stbtt_uint32 fdarrayoff;
  int y0_1;
  int x0_1;
  int iy0;
  int x1_1;
  stbtt__buf b;
  undefined4 in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb1c;
  int iVar177;
  int iVar178;
  stbtt_uint32 local_4ac;
  ulong local_4a8;
  undefined4 uStack_4a0;
  undefined4 uStack_49c;
  long local_490;
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  void *local_460;
  undefined1 local_458 [16];
  undefined8 local_448;
  void *pvStack_440;
  int local_430;
  uint local_42c;
  undefined8 local_428;
  void *pvStack_420;
  stbrp_node *local_418;
  undefined8 local_410;
  float local_404;
  ulong local_400;
  undefined1 local_3f8 [16];
  ulong local_3e0;
  undefined8 *local_3d8;
  ulong local_3d0;
  float local_3c8;
  int local_3c4;
  ulong local_3c0;
  uchar *local_3b8;
  long local_3b0;
  uchar *local_3a8;
  stbtt__point *local_3a0;
  ulong local_398;
  ulong local_390;
  float *local_388;
  uint local_380;
  uint local_37c;
  uint local_378;
  int local_374;
  int local_370;
  float local_36c;
  float local_368;
  int local_364;
  int local_360;
  int local_35c;
  stbrp_context *local_358;
  long local_350;
  stbtt_fontinfo *local_348;
  ulong local_340;
  float *local_338;
  ulong local_330;
  ulong local_328;
  stbtt__edge *local_320;
  undefined1 local_318 [16];
  float local_308;
  undefined4 uStack_304;
  undefined4 uStack_300;
  undefined4 uStack_2fc;
  ImFontConfig *local_2f8;
  long local_2f0;
  undefined2 *local_2e8;
  ulong local_2e0;
  long local_2d8;
  size_t local_2d0;
  size_t local_2c8;
  int local_2c0;
  int local_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  ulong local_298;
  undefined8 uStack_290;
  stbtt__buf local_288 [33];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  undefined4 uVar134;
  undefined6 uVar135;
  undefined8 uVar136;
  undefined1 auVar137 [12];
  undefined1 auVar138 [14];
  undefined1 auVar141 [16];
  undefined4 uVar160;
  undefined6 uVar161;
  undefined8 uVar162;
  undefined1 auVar163 [12];
  undefined1 auVar164 [14];
  undefined1 auVar169 [16];
  
  ImFontAtlasBuildInit(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  iVar93 = 0;
  pvVar61 = (void *)0x0;
  local_448 = 0;
  pvStack_440 = (void *)0x0;
  iVar178 = (atlas->ConfigData).Size;
  iVar59 = 0;
  __dest = pvVar61;
  if (0 < iVar178) {
    iVar177 = 8;
    if (7 < iVar178) {
      iVar177 = iVar178;
    }
    if ((0 < iVar177) &&
       (__dest = ImGui::MemAlloc((long)iVar177 * 0x110), iVar59 = iVar177, pvVar61 != (void *)0x0))
    {
      memcpy(__dest,pvVar61,(long)iVar93 * 0x110);
      ImGui::MemFree(pvVar61);
    }
  }
  uVar58 = (atlas->Fonts).Size;
  if (local_448._4_4_ < (int)uVar58) {
    if (local_448._4_4_ == 0) {
      uVar95 = 8;
    }
    else {
      uVar95 = local_448._4_4_ / 2 + local_448._4_4_;
    }
    if ((int)uVar95 <= (int)uVar58) {
      uVar95 = uVar58;
    }
    if (local_448._4_4_ < (int)uVar95) {
      pvVar61 = ImGui::MemAlloc((long)(int)uVar95 << 5);
      if (pvStack_440 != (void *)0x0) {
        memcpy(pvVar61,pvStack_440,(long)(int)local_448 << 5);
        ImGui::MemFree(pvStack_440);
      }
      local_448 = (ulong)uVar95 << 0x20;
      pvStack_440 = pvVar61;
    }
  }
  local_448 = CONCAT44(local_448._4_4_,uVar58);
  memset(__dest,0,(long)iVar178 * 0x110);
  memset(pvStack_440,0,(long)(int)local_448 << 5);
  iVar93 = (atlas->ConfigData).Size;
  iVar177 = CONCAT13(iVar93 < 1,(int3)in_stack_fffffffffffffb1c);
  if (0 < iVar93) {
    lVar90 = 0;
    pvVar61 = __dest;
    do {
      pIVar91 = (atlas->ConfigData).Data + lVar90;
      lVar73 = lVar90 * 0x110;
      *(undefined4 *)((long)pvVar61 + lVar73 + 0xe0) = 0xffffffff;
      uVar62 = (ulong)(atlas->Fonts).Size;
      __dest = pvVar61;
      if ((long)uVar62 < 1) goto LAB_001a8ee6;
      pIVar13 = pIVar91->DstFont;
      ppIVar14 = (atlas->Fonts).Data;
      uVar88 = 0xffffffff;
      uVar86 = 0;
      do {
        if (pIVar13 == ppIVar14[uVar86]) {
          *(int *)((long)pvVar61 + lVar73 + 0xe0) = (int)uVar86;
          uVar88 = uVar86 & 0xffffffff;
        }
        uVar86 = uVar86 + 1;
      } while ((uVar86 < uVar62) && ((int)uVar88 == -1));
      if ((int)uVar88 == -1) goto LAB_001a8ee6;
      data = (stbtt_uint8 *)pIVar91->FontData;
      iVar93 = pIVar91->FontNo;
      sVar11 = *data;
      local_3f8._0_8_ = pIVar91;
      if (((((sVar11 == '1') && (data[1] == '\0')) && (data[2] == '\0')) && (data[3] == '\0')) ||
         (((sVar11 == 't' && (data[1] == 'y')) && ((data[2] == 'p' && (data[3] == '1')))))) {
LAB_001a5e52:
        sVar57 = -(uint)(iVar93 != 0);
      }
      else {
        if (sVar11 == '\0') {
          if (((data[1] != '\x01') || (data[2] != '\0')) || (data[3] != '\0')) goto LAB_001a5e2b;
          goto LAB_001a5e52;
        }
        if ((((sVar11 == 'O') && (data[1] == 'T')) && (data[2] == 'T')) && (data[3] == 'O'))
        goto LAB_001a5e52;
LAB_001a5e2b:
        sVar57 = 0xffffffff;
        if (sVar11 == 't') {
          if (data[1] == 't') {
            if ((data[2] == 'c') && (data[3] == 'f')) {
              uVar58 = *(uint *)(data + 4);
              uVar58 = uVar58 >> 0x18 | (uVar58 & 0xff0000) >> 8 | (uVar58 & 0xff00) << 8 |
                       uVar58 << 0x18;
              if (((uVar58 == 0x20000) || (uVar58 == 0x10000)) &&
                 (uVar58 = *(uint *)(data + 8),
                 iVar93 < (int)(uVar58 >> 0x18 | (uVar58 & 0xff0000) >> 8 | (uVar58 & 0xff00) << 8 |
                               uVar58 << 0x18))) {
                uVar58 = *(uint *)(data + (long)iVar93 * 4 + 0xc);
                sVar57 = uVar58 >> 0x18 | (uVar58 & 0xff0000) >> 8 | (uVar58 & 0xff00) << 8 |
                         uVar58 << 0x18;
              }
            }
          }
          else if (((data[1] == 'r') && (data[2] == 'u')) && (data[3] == 'e')) goto LAB_001a5e52;
        }
      }
      *(stbtt_uint8 **)((long)pvVar61 + lVar73 + 8) = data;
      *(stbtt_uint32 *)((long)pvVar61 + lVar73 + 0x10) = sVar57;
      *(undefined8 *)((long)pvVar61 + lVar73 + 0x40) = 0;
      *(undefined8 *)((long)pvVar61 + lVar73 + 0x48) = 0;
      sVar51 = stbtt__find_table(data,sVar57,"cmap");
      local_4a8 = CONCAT44(extraout_var,sVar51);
      sVar51 = stbtt__find_table(data,sVar57,"loca");
      *(stbtt_uint32 *)((long)pvVar61 + lVar73 + 0x18) = sVar51;
      sVar52 = stbtt__find_table(data,sVar57,"head");
      *(stbtt_uint32 *)((long)pvVar61 + lVar73 + 0x1c) = sVar52;
      sVar53 = stbtt__find_table(data,sVar57,"glyf");
      *(stbtt_uint32 *)((long)pvVar61 + lVar73 + 0x20) = sVar53;
      sVar54 = stbtt__find_table(data,sVar57,"hhea");
      *(stbtt_uint32 *)((long)pvVar61 + lVar73 + 0x24) = sVar54;
      sVar55 = stbtt__find_table(data,sVar57,"hmtx");
      *(stbtt_uint32 *)((long)pvVar61 + lVar73 + 0x28) = sVar55;
      sVar56 = stbtt__find_table(data,sVar57,"kern");
      *(stbtt_uint32 *)((long)pvVar61 + lVar73 + 0x2c) = sVar56;
      local_478._0_4_ = sVar57;
      sVar57 = stbtt__find_table(data,sVar57,"GPOS");
      *(stbtt_uint32 *)((long)pvVar61 + lVar73 + 0x30) = sVar57;
      if (((((float)local_4a8 == 0.0) || (sVar52 == 0)) || (sVar54 == 0)) || (sVar55 == 0))
      goto LAB_001a8ee6;
      uVar134 = local_478._0_4_;
      if (sVar53 == 0) {
        local_428 = CONCAT44(local_428._4_4_,2);
        local_488._0_8_ = local_488._0_8_ & 0xffffffff00000000;
        local_410._0_4_ = 0;
        local_4ac = 0;
        sVar57 = stbtt__find_table(data,local_478._0_4_,"CFF ");
        if (sVar57 == 0) goto LAB_001a8ee6;
        *(undefined8 *)((long)pvVar61 + lVar73 + 0x90) = 0;
        *(undefined8 *)((long)pvVar61 + lVar73 + 0x98) = 0;
        *(undefined8 *)((long)pvVar61 + lVar73 + 0x80) = 0;
        *(undefined8 *)((long)pvVar61 + lVar73 + 0x88) = 0;
        *(stbtt_uint8 **)((long)pvVar61 + lVar73 + 0x40) = data + sVar57;
        *(undefined8 *)((long)pvVar61 + lVar73 + 0x48) = 0x2000000000000000;
        local_288[0].data = *(uchar **)((long)pvVar61 + lVar73 + 0x40);
        uVar136 = *(undefined8 *)((long)pvVar61 + lVar73 + 0x48);
        local_288[0].cursor = (int)uVar136;
        local_288[0].size = (int)((ulong)uVar136 >> 0x20);
        uVar58 = local_288[0].cursor + 2U;
        if (local_288[0].size < (int)(local_288[0].cursor + 2U)) {
          uVar58 = local_288[0].size;
        }
        if (local_288[0].cursor < -2) {
          uVar58 = local_288[0].size;
        }
        local_288[0].cursor = 0;
        if ((int)uVar58 < local_288[0].size) {
          local_288[0].cursor = (int)local_288[0].data[(int)uVar58];
        }
        if (local_288[0].size < local_288[0].cursor) {
          local_288[0].cursor = local_288[0].size;
        }
        stbtt__cff_get_index(local_288);
        sVar176 = stbtt__cff_get_index(local_288);
        local_458 = (undefined1  [16])stbtt__cff_index_get(sVar176,0);
        stbtt__cff_get_index(local_288);
        sVar176 = stbtt__cff_get_index(local_288);
        *(stbtt__buf *)((long)pvVar61 + lVar73 + 0x60) = sVar176;
        stbtt__dict_get_ints((stbtt__buf *)local_458,0x11,1,(stbtt_uint32 *)local_488);
        stbtt__dict_get_ints((stbtt__buf *)local_458,0x106,1,(stbtt_uint32 *)&local_428);
        stbtt__dict_get_ints((stbtt__buf *)local_458,0x124,1,(stbtt_uint32 *)&local_410);
        stbtt__dict_get_ints((stbtt__buf *)local_458,0x125,1,&local_4ac);
        sVar176.data._4_4_ = sVar51;
        sVar176.data._0_4_ = in_stack_fffffffffffffb10;
        sVar176.cursor = in_stack_fffffffffffffb18;
        sVar176.size = iVar177;
        fontdict.data._4_4_ = iVar59;
        fontdict.data._0_4_ = iVar178;
        fontdict._8_8_ = __dest;
        sVar176 = stbtt__get_subrs(sVar176,fontdict);
        sVar57 = local_4ac;
        *(stbtt__buf *)((long)pvVar61 + lVar73 + 0x70) = sVar176;
        if (((stbtt_uint32)local_428 != 2) || (uVar160 = local_488._0_4_, local_488._0_4_ == 0))
        goto LAB_001a8ee6;
        if ((stbtt_uint32)local_410 != 0) {
          uVar62 = (ulong)local_4ac;
          if (uVar62 == 0) goto LAB_001a8ee6;
          local_288[0].cursor = (stbtt_uint32)local_410;
          if (local_288[0].size < (int)(stbtt_uint32)local_410) {
            local_288[0].cursor = local_288[0].size;
          }
          if ((int)(stbtt_uint32)local_410 < 0) {
            local_288[0].cursor = local_288[0].size;
          }
          sVar176 = stbtt__cff_get_index(local_288);
          *(stbtt__buf *)((long)pvVar61 + lVar73 + 0x80) = sVar176;
          puVar63 = (uchar *)((ulong)(local_288[0].size - sVar57) << 0x20);
          puVar67 = local_288[0].data + uVar62;
          if ((int)(local_288[0].size - sVar57 | sVar57) < 0 || local_288[0].size < (int)sVar57) {
            puVar63 = (uchar *)0x0;
            puVar67 = (uchar *)0x0;
          }
          *(uchar **)((long)pvVar61 + lVar73 + 0x90) = puVar67;
          *(uchar **)((long)pvVar61 + lVar73 + 0x98) = puVar63;
        }
        local_288[0].cursor = uVar160;
        if (local_288[0].size < (int)uVar160) {
          local_288[0].cursor = local_288[0].size;
        }
        if ((int)uVar160 < 0) {
          local_288[0].cursor = local_288[0].size;
        }
        sVar176 = stbtt__cff_get_index(local_288);
        *(stbtt__buf *)((long)pvVar61 + lVar73 + 0x50) = sVar176;
      }
      else if (sVar51 == 0) goto LAB_001a8ee6;
      sVar57 = stbtt__find_table(data,uVar134,"maxp");
      if (sVar57 == 0) {
        uVar58 = 0xffff;
      }
      else {
        uVar58 = (uint)(ushort)(*(ushort *)(data + (ulong)sVar57 + 4) << 8 |
                               *(ushort *)(data + (ulong)sVar57 + 4) >> 8);
      }
      *(uint *)((long)pvVar61 + lVar73 + 0x14) = uVar58;
      *(undefined4 *)((long)pvVar61 + lVar73 + 0x34) = 0xffffffff;
      uVar50 = *(ushort *)(data + (local_4a8 & 0xffffffff) + 2) << 8 |
               *(ushort *)(data + (local_4a8 & 0xffffffff) + 2) >> 8;
      *(undefined4 *)((long)pvVar61 + lVar73 + 0x38) = 0;
      if (uVar50 != 0) {
        uVar58 = (int)local_4a8 + 4;
        uVar62 = (ulong)uVar50;
        do {
          uVar50 = *(ushort *)(data + uVar58) << 8 | *(ushort *)(data + uVar58) >> 8;
          if ((uVar50 == 0) ||
             ((uVar50 == 3 &&
              ((uVar50 = *(ushort *)(data + (ulong)uVar58 + 2) << 8 |
                         *(ushort *)(data + (ulong)uVar58 + 2) >> 8, uVar50 == 10 || (uVar50 == 1)))
              ))) {
            uVar95 = *(uint *)(data + (ulong)uVar58 + 4);
            *(uint *)((long)pvVar61 + lVar73 + 0x38) =
                 (uVar95 >> 0x18 | (uVar95 & 0xff0000) >> 8 | (uVar95 & 0xff00) << 8 |
                 uVar95 << 0x18) + (int)local_4a8;
          }
          uVar58 = uVar58 + 8;
          uVar62 = uVar62 - 1;
        } while (uVar62 != 0);
      }
      if (*(int *)((long)pvVar61 + lVar73 + 0x38) == 0) goto LAB_001a8ee6;
      *(uint *)((long)pvVar61 + lVar73 + 0x3c) =
           (uint)(ushort)(*(ushort *)(data + (long)*(int *)((long)pvVar61 + lVar73 + 0x1c) + 0x32)
                          << 8 | *(ushort *)
                                  (data + (long)*(int *)((long)pvVar61 + lVar73 + 0x1c) + 0x32) >> 8
                         );
      piVar64 = (int *)((long)*(int *)((long)pvVar61 + lVar73 + 0xe0) * 0x20 + (long)pvStack_440);
      pIVar74 = *(ImWchar **)(local_3f8._0_8_ + 0x38);
      if (pIVar74 == (ImWchar *)0x0) {
        pIVar74 = ImFontAtlas::GetGlyphRangesDefault::ranges;
      }
      *(ImWchar **)((long)pvVar61 + lVar73 + 0xd8) = pIVar74;
      IVar12 = *pIVar74;
      while (IVar12 != 0) {
        uVar50 = pIVar74[1];
        if (uVar50 == 0) break;
        uVar58 = *(uint *)((long)pvVar61 + lVar73 + 0xe4);
        uVar95 = (uint)uVar50;
        if ((int)(uint)uVar50 < (int)uVar58) {
          uVar95 = uVar58;
        }
        *(uint *)((long)pvVar61 + lVar73 + 0xe4) = uVar95;
        IVar12 = pIVar74[2];
        pIVar74 = pIVar74 + 2;
      }
      *piVar64 = *piVar64 + 1;
      iVar93 = *(int *)((long)pvVar61 + lVar73 + 0xe4);
      if (iVar93 < piVar64[1]) {
        iVar93 = piVar64[1];
      }
      piVar64[1] = iVar93;
      lVar90 = lVar90 + 1;
      lVar73 = (long)(atlas->ConfigData).Size;
      iVar177 = CONCAT13(lVar73 <= lVar90,(int3)iVar177);
      pvVar61 = __dest;
    } while (lVar90 < lVar73);
  }
  uVar62 = 0;
  if (0 < iVar178) {
    lVar90 = 0;
    uVar62 = 0;
    pvVar61 = __dest;
    do {
      lVar73 = lVar90 * 0x110;
      pvVar94 = (void *)((long)*(int *)((long)pvVar61 + lVar73 + 0xe0) * 0x20 + (long)pvStack_440);
      __dest = pvVar61;
      ImBitVector::Create((ImBitVector *)((long)pvVar61 + lVar73 + 0xf0),
                          *(int *)((long)pvVar61 + lVar73 + 0xe4) + 1);
      if (*(int *)((long)pvVar94 + 0x10) == 0) {
        ImBitVector::Create((ImBitVector *)((long)pvVar94 + 0x10),*(int *)((long)pvVar94 + 4) + 1);
      }
      psVar82 = (stbtt_fontinfo *)((long)pvVar61 + lVar73);
      puVar75 = *(ushort **)&psVar82[1].index_map;
      uVar50 = *puVar75;
      if (uVar50 != 0) {
        local_478._0_8_ = pvVar94;
        do {
          uVar107 = puVar75[1];
          if (uVar107 == 0) break;
          local_4a8 = uVar62;
          if (uVar50 <= uVar107) {
            uVar62 = (ulong)uVar50;
            lVar73 = *(long *)(local_478._0_8_ + 0x18);
            do {
              uVar58 = (uint)uVar62;
              uVar95 = 1 << ((byte)uVar62 & 0x1f);
              if (((*(uint *)(lVar73 + (uVar62 >> 5) * 4) >> (uVar58 & 0x1f) & 1) == 0) &&
                 (iVar59 = stbtt_FindGlyphIndex(psVar82,uVar58), iVar59 != 0)) {
                piVar64 = &psVar82[1].cff.cursor;
                *piVar64 = *piVar64 + 1;
                *(int *)(local_478._0_8_ + 8) = *(int *)(local_478._0_8_ + 8) + 1;
                uVar62 = (ulong)(uint)((int)(uVar62 >> 5) << 2);
                puVar1 = (uint *)(*(long *)&psVar82[1].charstrings.cursor + uVar62);
                *puVar1 = *puVar1 | uVar95;
                puVar1 = (uint *)(lVar73 + uVar62);
                *puVar1 = *puVar1 | uVar95;
                local_4a8 = (ulong)((int)local_4a8 + 1);
              }
              uVar62 = (ulong)(uVar58 + 1);
            } while (uVar107 + 1 != uVar58 + 1);
          }
          uVar50 = puVar75[2];
          puVar75 = puVar75 + 2;
          uVar62 = local_4a8;
        } while (uVar50 != 0);
      }
      lVar90 = lVar90 + 1;
      pvVar61 = __dest;
    } while (lVar90 < iVar178);
  }
  local_4a8 = uVar62;
  if (0 < iVar178) {
    lVar90 = 0;
    pvVar61 = __dest;
    do {
      lVar73 = lVar90 * 0x110;
      iVar59 = *(int *)((long)pvVar61 + lVar73 + 0xe8);
      __dest = pvVar61;
      if (*(int *)((long)pvVar61 + lVar73 + 0x104) < iVar59) {
        pvVar65 = ImGui::MemAlloc((long)iVar59 << 2);
        pvVar94 = *(void **)((long)pvVar61 + lVar73 + 0x108);
        if (pvVar94 != (void *)0x0) {
          memcpy(pvVar65,pvVar94,(long)*(int *)((long)pvVar61 + lVar73 + 0x100) << 2);
          ImGui::MemFree(*(void **)((long)pvVar61 + lVar73 + 0x108));
        }
        *(void **)((long)pvVar61 + lVar73 + 0x108) = pvVar65;
        *(int *)((long)pvVar61 + lVar73 + 0x104) = iVar59;
      }
      lVar66 = (long)*(int *)((long)pvVar61 + lVar73 + 0xf0);
      if (0 < lVar66) {
        puVar76 = *(uint **)((long)pvVar61 + lVar73 + 0xf8);
        puVar1 = puVar76 + lVar66;
        iVar59 = 0;
        do {
          local_478._0_8_ = puVar76;
          uVar58 = *puVar76;
          if (uVar58 != 0) {
            uVar95 = 0;
            do {
              if ((uVar58 >> (uVar95 & 0x1f) & 1) != 0) {
                iVar93 = *(int *)((long)pvVar61 + lVar73 + 0x100);
                iVar92 = *(int *)((long)pvVar61 + lVar73 + 0x104);
                if (iVar93 == iVar92) {
                  if (iVar92 == 0) {
                    iVar72 = 8;
                  }
                  else {
                    iVar72 = iVar92 / 2 + iVar92;
                  }
                  iVar93 = iVar93 + 1;
                  if (iVar93 < iVar72) {
                    iVar93 = iVar72;
                  }
                  if (iVar92 < iVar93) {
                    pvVar65 = ImGui::MemAlloc((long)iVar93 << 2);
                    pvVar94 = *(void **)((long)pvVar61 + lVar73 + 0x108);
                    if (pvVar94 != (void *)0x0) {
                      memcpy(pvVar65,pvVar94,(long)*(int *)((long)pvVar61 + lVar73 + 0x100) << 2);
                      ImGui::MemFree(*(void **)((long)pvVar61 + lVar73 + 0x108));
                    }
                    *(void **)((long)pvVar61 + lVar73 + 0x108) = pvVar65;
                    *(int *)((long)pvVar61 + lVar73 + 0x104) = iVar93;
                  }
                }
                *(uint *)(*(long *)((long)pvVar61 + lVar73 + 0x108) +
                         (long)*(int *)((long)pvVar61 + lVar73 + 0x100) * 4) = iVar59 + uVar95;
                piVar64 = (int *)((long)pvVar61 + lVar73 + 0x100);
                *piVar64 = *piVar64 + 1;
              }
              uVar95 = uVar95 + 1;
            } while (uVar95 != 0x20);
          }
          puVar76 = (uint *)(local_478._0_8_ + 4);
          iVar59 = iVar59 + 0x20;
        } while (puVar76 < puVar1);
      }
      pvVar94 = *(void **)((long)pvVar61 + lVar73 + 0xf8);
      if (pvVar94 != (void *)0x0) {
        *(undefined8 *)((long)pvVar61 + lVar73 + 0xf0) = 0;
        ImGui::MemFree(pvVar94);
        *(undefined8 *)((long)pvVar61 + lVar73 + 0xf8) = 0;
      }
      lVar90 = lVar90 + 1;
      pvVar61 = __dest;
    } while (lVar90 < iVar178);
  }
  uVar58 = (uint)local_4a8;
  if (0 < (int)local_448) {
    lVar90 = 0x18;
    lVar73 = 0;
    do {
      pvVar61 = pvStack_440;
      if (*(void **)((long)pvStack_440 + lVar90) != (void *)0x0) {
        *(undefined8 *)((long)pvStack_440 + lVar90 + -8) = 0;
        ImGui::MemFree(*(void **)((long)pvStack_440 + lVar90));
        *(undefined8 *)((long)pvVar61 + lVar90) = 0;
      }
      lVar73 = lVar73 + 1;
      lVar90 = lVar90 + 0x20;
    } while (lVar73 < (int)local_448);
  }
  if (pvStack_440 != (void *)0x0) {
    local_448 = 0;
    ImGui::MemFree(pvStack_440);
    pvStack_440 = (void *)0x0;
  }
  local_458 = ZEXT816(0);
  local_428 = 0;
  pvStack_420 = (void *)0x0;
  if (0 < (int)uVar58) {
    uVar58 = (uint)local_4a8;
    uVar95 = 8;
    if (7 < (int)uVar58) {
      uVar95 = uVar58;
    }
    if (0 < (int)uVar95) {
      pvVar61 = ImGui::MemAlloc((long)(int)uVar95 * 0x18);
      if ((void *)local_458._8_8_ != (void *)0x0) {
        memcpy(pvVar61,(void *)local_458._8_8_,(long)(int)local_458._0_4_ * 0x18);
        ImGui::MemFree((void *)local_458._8_8_);
      }
      auVar108._4_8_ = pvVar61;
      auVar108._0_4_ = uVar95;
      auVar108._12_4_ = 0;
      local_458 = auVar108 << 0x20;
      uVar58 = (uint)local_4a8;
    }
  }
  local_458._0_4_ = uVar58;
  if (local_428._4_4_ < (int)uVar58) {
    if (local_428._4_4_ == 0) {
      uVar95 = 8;
    }
    else {
      uVar95 = local_428._4_4_ / 2 + local_428._4_4_;
    }
    uVar58 = (uint)local_4a8;
    if ((int)uVar95 <= (int)uVar58) {
      uVar95 = uVar58;
    }
    if (local_428._4_4_ < (int)uVar95) {
      pvVar61 = ImGui::MemAlloc((long)(int)uVar95 * 0x1c);
      if (pvStack_420 != (void *)0x0) {
        memcpy(pvVar61,pvStack_420,(long)(int)(stbtt_uint32)local_428 * 0x1c);
        ImGui::MemFree(pvStack_420);
      }
      local_428 = (ulong)uVar95 << 0x20;
      uVar58 = (uint)local_4a8;
      pvStack_420 = pvVar61;
    }
  }
  local_428 = CONCAT44(local_428._4_4_,uVar58);
  iVar59 = 0;
  memset((void *)local_458._8_8_,0,(long)(int)local_458._0_4_ * 0x18);
  memset(pvStack_420,0,(long)(int)(stbtt_uint32)local_428 * 0x1c);
  fVar99 = 0.0;
  if (0 < iVar178) {
    lVar90 = 0;
    iVar92 = 0;
    iVar93 = 0;
    do {
      iVar72 = *(int *)((long)__dest + lVar90 * 0x110 + 0xe8);
      if (iVar72 != 0) {
        psVar82 = (stbtt_fontinfo *)((long)__dest + lVar90 * 0x110);
        *(long *)&psVar82[1].hmtx = (long)iVar92 * 0x18 + local_458._8_8_;
        pvVar61 = (void *)((long)iVar93 * 0x1c + (long)pvStack_420);
        *(void **)&psVar82[1].gpos = pvVar61;
        pIVar91 = (atlas->ConfigData).Data;
        fVar99 = pIVar91[lVar90].SizePixels;
        fVar100 = pIVar91[lVar90].RasterizerDensity;
        fVar111 = fVar99 * fVar100;
        *(float *)&psVar82[1].userdata = fVar111;
        *(undefined4 *)((long)&psVar82[1].userdata + 4) = 0;
        psVar82[1].data = *(uchar **)&psVar82[1].gsubrs.cursor;
        psVar82[1].fontstart = *(int *)&psVar82[1].gsubrs.data;
        *(void **)&psVar82[1].loca = pvVar61;
        *(char *)&psVar82[1].glyf = (char)pIVar91[lVar90].OversampleH;
        *(char *)((long)&psVar82[1].glyf + 1) = (char)pIVar91[lVar90].OversampleV;
        if (fVar99 <= 0.0) {
          fVar111 = (fVar100 * -fVar99) /
                    (float)(ushort)(*(ushort *)(psVar82->data + (long)psVar82->head + 0x12) << 8 |
                                   *(ushort *)(psVar82->data + (long)psVar82->head + 0x12) >> 8);
        }
        else {
          puVar67 = psVar82->data;
          lVar73 = (long)psVar82->hhea;
          fVar111 = fVar111 / (float)(int)(((int)(short)((ushort)puVar67[lVar73 + 4] << 8) |
                                           (uint)puVar67[lVar73 + 5]) -
                                          ((int)(short)((ushort)puVar67[lVar73 + 6] << 8) |
                                          (uint)puVar67[lVar73 + 7]));
        }
        iVar92 = iVar92 + iVar72;
        iVar93 = iVar93 + iVar72;
        if (0 < *(int *)&psVar82[1].gsubrs.data) {
          local_478._0_8_ = lVar90;
          iVar72 = atlas->TexGlyphPadding + -1;
          lVar66 = 2;
          lVar73 = 0;
          local_4a8 = (ulong)(uint)fVar111;
          uStack_4a0 = 0;
          uStack_49c = 0;
          do {
            iVar60 = stbtt_FindGlyphIndex
                               (psVar82,*(int *)(*(long *)&psVar82[1].gsubrs.cursor + lVar73 * 4));
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar82,iVar60,(float)pIVar91[lVar90].OversampleH * (float)local_4a8,
                       (float)pIVar91[lVar90].OversampleV * (float)local_4a8,(float)local_4a8,
                       in_XMM3._0_4_,(int *)local_288,(int *)local_488,(int *)&local_410,
                       (int *)&local_4ac);
            iVar60 = (((stbtt_uint32)local_410 + iVar72) - (int)local_288[0].data) +
                     pIVar91[lVar90].OversampleH;
            lVar80 = *(long *)&psVar82[1].hmtx;
            *(int *)(lVar80 + -4 + lVar66 * 4) = iVar60;
            iVar79 = ((local_4ac + iVar72) - local_488._0_4_) + pIVar91[lVar90].OversampleV;
            *(int *)(lVar80 + lVar66 * 4) = iVar79;
            iVar59 = iVar59 + iVar79 * iVar60;
            lVar73 = lVar73 + 1;
            lVar66 = lVar66 + 6;
          } while (lVar73 < *(int *)&psVar82[1].gsubrs.data);
          lVar90 = local_478._0_8_;
        }
      }
      lVar90 = lVar90 + 1;
    } while (lVar90 < iVar178);
    fVar99 = (float)iVar59;
  }
  if (fVar99 < 0.0) {
    fVar99 = sqrtf(fVar99);
  }
  else {
    fVar99 = SQRT(fVar99);
  }
  atlas->TexHeight = 0;
  iVar59 = atlas->TexDesiredWidth;
  if (iVar59 < 1) {
    iVar93 = (int)fVar99;
    iVar59 = 0x1000;
    if ((iVar93 < 0xb33) && (iVar59 = 0x800, iVar93 < 0x599)) {
      iVar59 = (uint)(0x2cb < iVar93) * 0x200 + 0x200;
    }
  }
  atlas->TexWidth = iVar59;
  local_488._12_4_ = atlas->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  iVar93 = iVar59 - local_488._12_4_;
  local_418 = (stbrp_node *)ImGui::MemAlloc((long)iVar93 << 4);
  if ((ptr == (stbrp_context *)0x0) || (local_418 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (local_418 != (stbrp_node *)0x0) {
      ImGui::MemFree(local_418);
    }
    local_418 = (stbrp_node *)0x0;
    local_488._12_4_ = 0.0;
    iVar59 = 0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    if (iVar93 < 2) {
      uVar62 = 0;
    }
    else {
      uVar62 = 0;
      psVar31 = local_418;
      do {
        uVar62 = uVar62 + 1;
        psVar31->next = psVar31 + 1;
        psVar31 = psVar31 + 1;
      } while (iVar93 - 1 != uVar62);
      uVar62 = uVar62 & 0xffffffff;
    }
    local_418[uVar62].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = local_418;
    ptr->active_head = ptr->extra;
    ptr->width = iVar93;
    ptr->height = 0x8000 - local_488._12_4_;
    ptr->num_nodes = iVar93;
    ptr->align = (iVar93 * 2 + -1) / iVar93;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = iVar93;
    ptr->extra[1].y = 0x40000000;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  local_358 = ptr;
  ImFontAtlasBuildPackCustomRects(atlas,ptr);
  if (0 < iVar178) {
    lVar90 = 0;
    pvVar61 = __dest;
    do {
      lVar73 = lVar90 * 0x110;
      iVar93 = *(int *)((long)pvVar61 + lVar73 + 0xe8);
      __dest = pvVar61;
      if (iVar93 != 0) {
        stbrp_pack_rects(local_358,*(stbrp_rect **)((long)pvVar61 + lVar73 + 200),iVar93);
        lVar66 = (long)*(int *)((long)pvVar61 + lVar73 + 0xe8);
        if (0 < lVar66) {
          lVar73 = *(long *)((long)pvVar61 + lVar73 + 200);
          lVar80 = 0;
          do {
            if (*(int *)(lVar73 + 0x14 + lVar80) != 0) {
              iVar93 = *(int *)(lVar73 + 8 + lVar80) + *(int *)(lVar73 + 0x10 + lVar80);
              if (iVar93 < atlas->TexHeight) {
                iVar93 = atlas->TexHeight;
              }
              atlas->TexHeight = iVar93;
            }
            lVar80 = lVar80 + 0x18;
          } while (lVar66 * 0x18 != lVar80);
        }
      }
      lVar90 = lVar90 + 1;
      pvVar61 = __dest;
    } while (lVar90 < iVar178);
  }
  uVar58 = atlas->TexHeight;
  if ((atlas->Flags & 1) == 0) {
    uVar58 = (int)(uVar58 - 1) >> 1 | uVar58 - 1;
    uVar58 = (int)uVar58 >> 2 | uVar58;
    uVar58 = (int)uVar58 >> 4 | uVar58;
    uVar58 = (int)uVar58 >> 8 | uVar58;
    uVar58 = (int)uVar58 >> 0x10 | uVar58;
  }
  iVar93 = uVar58 + 1;
  atlas->TexHeight = iVar93;
  auVar101._0_4_ = (float)atlas->TexWidth;
  auVar101._4_4_ = (float)iVar93;
  auVar101._8_8_ = 0;
  auVar108 = divps(_DAT_001ec3c0,auVar101);
  atlas->TexUvScale = auVar108._0_8_;
  puVar67 = (uchar *)ImGui::MemAlloc((long)(iVar93 * atlas->TexWidth));
  atlas->TexPixelsAlpha8 = puVar67;
  memset(puVar67,0,(long)atlas->TexHeight * (long)atlas->TexWidth);
  if (0 < iVar178) {
    local_3b8 = atlas->TexPixelsAlpha8;
    local_490 = (long)iVar59;
    local_78 = CONCAT44(local_488._12_4_,local_488._12_4_);
    uStack_70 = 0;
    lVar90 = 0;
    local_374 = iVar59;
    auVar108 = _DAT_001f9e30;
    auVar101 = _DAT_001ec3b0;
    do {
      local_350 = lVar90;
      if (*(int *)((long)__dest + lVar90 * 0x110 + 0xe8) != 0) {
        psVar82 = (stbtt_fontinfo *)((long)__dest + lVar90 * 0x110);
        fVar99 = *(float *)&psVar82[1].userdata;
        if (fVar99 <= 0.0) {
          auVar123._4_4_ = auVar101._4_4_;
          auVar123._0_4_ = (uint)fVar99 ^ auVar101._0_4_;
          auVar123._8_4_ = auVar101._8_4_;
          auVar123._12_4_ = auVar101._12_4_;
          uVar58 = (uint)(ushort)(*(ushort *)(psVar82->data + (long)psVar82->head + 0x12) << 8 |
                                 *(ushort *)(psVar82->data + (long)psVar82->head + 0x12) >> 8);
        }
        else {
          puVar67 = psVar82->data;
          lVar90 = (long)psVar82->hhea;
          uVar58 = ((int)(short)((ushort)puVar67[lVar90 + 4] << 8) | (uint)puVar67[lVar90 + 5]) -
                   ((int)(short)((ushort)puVar67[lVar90 + 6] << 8) | (uint)puVar67[lVar90 + 7]);
          auVar123 = ZEXT416((uint)fVar99);
        }
        local_318._4_12_ = auVar123._4_12_;
        local_318._0_4_ = auVar123._0_4_ / (float)(int)uVar58;
        local_2f8 = (atlas->ConfigData).Data;
        if (0 < psVar82[1].fontstart) {
          lVar90._0_4_ = psVar82[1].hmtx;
          lVar90._4_4_ = psVar82[1].kern;
          local_298._0_4_ = psVar82[1].glyf;
          local_298._4_4_ = psVar82[1].hhea;
          uStack_290 = 0;
          auVar42._8_6_ = 0;
          auVar42._0_8_ = local_298;
          auVar42[0xe] = (char)((uint)local_298._4_4_ >> 0x18);
          auVar44._8_4_ = 0;
          auVar44._0_8_ = local_298;
          auVar44[0xc] = (char)((uint)local_298._4_4_ >> 0x10);
          auVar44._13_2_ = auVar42._13_2_;
          auVar45._8_4_ = 0;
          auVar45._0_8_ = local_298;
          auVar45._12_3_ = auVar44._12_3_;
          auVar46._8_2_ = 0;
          auVar46._0_8_ = local_298;
          auVar46[10] = (char)((uint)local_298._4_4_ >> 8);
          auVar46._11_4_ = auVar45._11_4_;
          auVar47._8_2_ = 0;
          auVar47._0_8_ = local_298;
          auVar47._10_5_ = auVar46._10_5_;
          auVar48[8] = (char)local_298._4_4_;
          auVar48._0_8_ = local_298;
          auVar48._9_6_ = auVar47._9_6_;
          cVar106 = (char)((uint)(undefined4)local_298 >> 0x18);
          Var36 = CONCAT91((unkuint9)auVar48._8_7_ << 8,cVar106);
          auVar41[10] = 0;
          auVar41._0_10_ = Var36;
          cVar105 = (char)((uint)(undefined4)local_298 >> 0x10);
          auVar35._1_11_ = auVar41 << 8;
          auVar35[0] = cVar105;
          auVar40[0xc] = 0;
          auVar40._0_12_ = auVar35;
          bVar104 = (byte)((uint)(undefined4)local_298 >> 8);
          auVar34._1_13_ = auVar40 << 8;
          auVar34[0] = bVar104;
          bVar98 = (byte)(undefined4)local_298;
          auVar149._0_2_ = CONCAT11(0,bVar98);
          auVar149._2_14_ = auVar34;
          uVar50 = auVar34._0_2_;
          sVar30 = -auVar35._0_2_;
          uVar107 = (ushort)Var36;
          sVar132 = -uVar107;
          auVar43._10_2_ = 0;
          auVar43._0_10_ = auVar149._0_10_;
          auVar43._12_2_ = uVar107;
          uVar49 = CONCAT42(auVar43._10_4_,auVar35._0_2_);
          auVar165._4_2_ = uVar50;
          auVar165._0_4_ = auVar149._0_4_;
          auVar165._6_10_ = (unkuint10)uVar49 << 0x10;
          auVar102._0_4_ = (float)auVar149._0_2_;
          auVar102._4_4_ = (float)auVar165._4_4_;
          auVar102._8_4_ = (float)(int)uVar49;
          auVar102._12_4_ = (float)uVar107;
          local_68 = divps(_DAT_001ec3c0,auVar102);
          auVar115[0] = -(bVar98 == 0);
          auVar115[1] = -(bVar98 == 0);
          auVar115[2] = -(bVar98 == 0);
          auVar115[3] = -(bVar98 == 0);
          auVar115[4] = -(bVar104 == 0);
          auVar115[5] = -(bVar104 == 0);
          auVar115[6] = -(bVar104 == 0);
          auVar115[7] = -(bVar104 == 0);
          auVar115[8] = -(cVar105 == '\0');
          auVar115[9] = -(cVar105 == '\0');
          auVar115[10] = -(cVar105 == '\0');
          auVar115[0xb] = -(cVar105 == '\0');
          auVar115[0xc] = -(cVar106 == '\0');
          auVar115[0xd] = -(cVar106 == '\0');
          auVar115[0xe] = -(cVar106 == '\0');
          auVar115[0xf] = -(cVar106 == '\0');
          Var39 = CONCAT64(CONCAT42(CONCAT22(sVar132,sVar132),sVar30),CONCAT22(sVar30,sVar132));
          auVar37._4_8_ = (long)((unkuint10)Var39 >> 0x10);
          auVar37._2_2_ = 1 - uVar50;
          auVar37._0_2_ = 1 - uVar50;
          auVar109._0_4_ = (float)(int)(short)(1 - auVar149._0_2_);
          auVar109._4_4_ = (float)(auVar37._0_4_ >> 0x10);
          auVar109._8_4_ = (float)((int)((unkuint10)Var39 >> 0x10) >> 0x10);
          auVar109._12_4_ = (float)(int)sVar132;
          auVar139._0_4_ = (float)local_318._0_4_ * auVar102._0_4_;
          auVar139._4_4_ = (float)local_318._0_4_ * auVar102._4_4_;
          auVar139._8_4_ = (float)local_318._0_4_ * auVar102._8_4_;
          auVar139._12_4_ = (float)local_318._0_4_ * auVar102._12_4_;
          auVar103._0_4_ = auVar102._0_4_ + auVar102._0_4_;
          auVar103._4_4_ = auVar102._4_4_ + auVar102._4_4_;
          auVar103._8_4_ = auVar102._8_4_ + auVar102._8_4_;
          auVar103._12_4_ = auVar102._12_4_ + auVar102._12_4_;
          auVar108 = divps(auVar109,auVar103);
          local_58 = ~auVar115 & auVar108;
          fVar99 = auVar139._4_4_;
          if (auVar139._0_4_ <= auVar139._4_4_) {
            fVar99 = auVar139._0_4_;
          }
          local_3c8 = (0.35 / fVar99) * (0.35 / fVar99);
          local_2b8 = auVar139._4_4_;
          fStack_2b4 = auVar139._4_4_;
          fStack_2b0 = auVar139._4_4_;
          fStack_2ac = auVar139._4_4_;
          uVar58 = (uint)auVar139._4_4_ ^ (uint)DAT_001ec3b0;
          local_328 = local_298 & 0xff;
          local_330 = (ulong)bVar104;
          local_2a8 = auVar139;
          local_48._4_4_ = uVar58;
          local_48._0_4_ = auVar139._0_4_;
          fStack_40 = auVar139._0_4_;
          fStack_3c = (float)uVar58;
          uVar86 = 0xffffffff;
          uVar62 = 0;
          local_2f0 = lVar90;
          local_348 = psVar82;
          local_400 = (ulong)uVar50;
          local_3e0 = (ulong)(auVar149._0_4_ & 0xffff);
          auVar108 = _DAT_001f9e30;
          auVar101 = _DAT_001ec3b0;
          do {
            fVar99 = auVar139._0_4_;
            iVar59 = *(int *)(lVar90 + 0x14 + uVar62 * 0x18);
            if (iVar59 != 0) {
              lVar73 = lVar90 + uVar62 * 0x18;
              iVar93 = *(int *)(lVar73 + 4);
              if ((iVar93 == 0) || (iVar92 = *(int *)(lVar73 + 8), iVar92 == 0)) {
                if ((iVar59 != 0) &&
                   (((*(int *)(lVar73 + 4) == 0 && (*(int *)(lVar73 + 8) == 0)) &&
                    (-1 < (int)(uint)uVar86)))) {
                  lVar73 = *(long *)&psVar82[1].loca;
                  puVar2 = (undefined4 *)(lVar73 + uVar86 * 0x1c);
                  uVar134 = *puVar2;
                  uVar160 = puVar2[1];
                  uVar32 = puVar2[2];
                  uVar33 = puVar2[3];
                  puVar71 = (undefined8 *)(lVar73 + 0xc + uVar86 * 0x1c);
                  uVar136 = puVar71[1];
                  puVar15 = (undefined8 *)(lVar73 + 0xc + uVar62 * 0x1c);
                  *puVar15 = *puVar71;
                  puVar15[1] = uVar136;
                  auVar108 = _DAT_001f9e30;
                  puVar2 = (undefined4 *)(lVar73 + uVar62 * 0x1c);
                  *puVar2 = uVar134;
                  puVar2[1] = uVar160;
                  puVar2[2] = uVar32;
                  puVar2[3] = uVar33;
                }
              }
              else {
                if (psVar82[1].data == (uchar *)0x0) {
                  iVar59 = *(int *)((long)&psVar82[1].userdata + 4) + (int)uVar62;
                }
                else {
                  iVar59 = *(int *)(psVar82[1].data + uVar62 * 4);
                }
                local_2e8 = (undefined2 *)(uVar62 * 0x1c + *(long *)&psVar82[1].loca);
                local_378 = (uint)uVar86;
                local_2e0 = uVar62;
                uVar58 = stbtt_FindGlyphIndex(psVar82,iVar59);
                fVar100 = auVar101._0_4_;
                *(ulong *)(lVar73 + 0xc) =
                     CONCAT44((int)((ulong)*(undefined8 *)(lVar73 + 0xc) >> 0x20) + local_78._4_4_,
                              (int)*(undefined8 *)(lVar73 + 0xc) + (int)local_78);
                *(int *)(lVar73 + 4) = iVar93 - local_488._12_4_;
                *(int *)(lVar73 + 8) = iVar92 - local_488._12_4_;
                puVar67 = psVar82->data;
                uVar50 = *(ushort *)(puVar67 + (long)psVar82->hhea + 0x22) << 8 |
                         *(ushort *)(puVar67 + (long)psVar82->hhea + 0x22) >> 8;
                iVar59 = psVar82->hmtx;
                lVar90 = (ulong)uVar50 * 4 + (long)iVar59 + -4;
                lVar66 = (ulong)uVar50 * 4 + (long)iVar59 + -3;
                if ((int)uVar58 < (int)(uint)uVar50) {
                  lVar90 = (long)(int)(uVar58 * 4) + (long)iVar59;
                  lVar66 = (long)(int)(uVar58 * 4) + 1 + (long)iVar59;
                }
                local_37c = (uint)puVar67[lVar90];
                local_380 = (uint)puVar67[lVar66];
                stbtt_GetGlyphBitmapBoxSubpixel
                          (psVar82,uVar58,(float)local_2a8._0_4_,local_2b8,fVar100,fVar99,&local_360
                           ,&local_364,&local_2bc,&local_2c0);
                iVar59 = *(int *)(lVar73 + 0xc);
                local_3a8 = (uchar *)(long)*(int *)(lVar73 + 0x10);
                local_3d0 = (ulong)*(uint *)(lVar73 + 4);
                local_3c0 = (ulong)*(uint *)(lVar73 + 8);
                local_3b0 = lVar73;
                local_340 = (ulong)uVar58;
                iVar93 = stbtt_GetGlyphShape(psVar82,uVar58,(stbtt_vertex **)&local_410);
                local_478._0_4_ = iVar93;
                uVar58 = ((int)local_3d0 - (int)local_3e0) + 1;
                stbtt_GetGlyphBitmapBoxSubpixel
                          (local_348,(int)local_340,(float)local_2a8._0_4_,local_2b8,fVar100,fVar99,
                           (int *)&local_4ac,&local_35c,(int *)0x0,(int *)0x0);
                iVar93 = local_35c;
                local_42c = uVar58;
                if (uVar58 != 0) {
                  iVar92 = ((int)local_3c0 - (int)local_400) + 1;
                  local_3f8._0_4_ = iVar92;
                  if (iVar92 != 0) {
                    lVar90 = CONCAT44(local_410._4_4_,(stbtt_uint32)local_410);
                    local_288[0].data = (uchar *)((ulong)local_288[0].data & 0xffffffff00000000);
                    uVar62 = (ulong)(uint)local_478._0_4_;
                    if ((int)local_478._0_4_ < 1) {
                      uVar58 = 0;
                    }
                    else {
                      lVar73 = 0;
                      uVar58 = 0;
                      do {
                        uVar58 = uVar58 + (*(char *)(lVar90 + 0xc + lVar73) == '\x01');
                        lVar73 = lVar73 + 0xe;
                      } while (uVar62 * 0xe != lVar73);
                    }
                    local_430 = local_35c;
                    sVar57 = local_4ac;
                    if (uVar58 == 0) {
LAB_001a75dc:
                      local_460 = (void *)0x0;
LAB_001a75e8:
                      points = (stbtt__point *)0x0;
                    }
                    else {
                      local_460 = ImGui::MemAlloc((long)(int)uVar58 << 2);
                      if (local_460 == (void *)0x0) {
                        uVar58 = 0;
                        goto LAB_001a75e8;
                      }
                      uVar86 = 0;
                      points = (stbtt__point *)0x0;
                      iVar92 = 0;
                      do {
                        if (iVar92 == 0) {
LAB_001a73a0:
                          local_288[0].data =
                               (uchar *)((ulong)local_288[0].data & 0xffffffff00000000);
                          if ((int)local_478._0_4_ < 1) {
                            lVar73 = -1;
                          }
                          else {
                            fVar99 = 0.0;
                            fVar100 = 0.0;
                            uVar95 = 0xffffffff;
                            lVar73 = 0;
                            local_4a8 = uVar86;
                            do {
                              puVar67 = local_288[0].data;
                              switch(*(undefined1 *)(lVar90 + 0xc + lVar73)) {
                              case 1:
                                if (-1 < (int)uVar95) {
                                  *(int *)((long)local_460 + (ulong)uVar95 * 4) =
                                       (int)local_288[0].data - (int)(float)local_4a8;
                                }
                                uVar95 = uVar95 + 1;
                                local_4a8 = (ulong)local_288[0].data & 0xffffffff;
                                auVar108 = pshuflw(ZEXT416(*(uint *)(lVar90 + lVar73)),
                                                   ZEXT416(*(uint *)(lVar90 + lVar73)),0x60);
                                iVar93 = auVar108._0_4_;
                                iVar72 = auVar108._4_4_;
                                break;
                              case 2:
                                auVar108 = pshuflw(ZEXT416(*(uint *)(lVar90 + lVar73)),
                                                   ZEXT416(*(uint *)(lVar90 + lVar73)),0x60);
                                iVar93 = auVar108._0_4_;
                                iVar72 = auVar108._4_4_;
                                break;
                              case 3:
                                stbtt__tesselate_curve
                                          (points,(int *)local_288,fVar99,fVar100,
                                           (float)(int)*(short *)(lVar90 + 4 + lVar73),
                                           (float)(int)*(short *)(lVar90 + 6 + lVar73),
                                           (float)(int)*(short *)(lVar90 + lVar73),
                                           (float)(int)*(short *)(lVar90 + 2 + lVar73),local_3c8,0);
                                goto LAB_001a7517;
                              case 4:
                                stbtt__tesselate_cubic
                                          (points,(int *)local_288,fVar99,fVar100,
                                           (float)(int)*(short *)(lVar90 + 4 + lVar73),
                                           (float)(int)*(short *)(lVar90 + 6 + lVar73),
                                           (float)(int)*(short *)(lVar90 + 8 + lVar73),
                                           (float)(int)*(short *)(lVar90 + 10 + lVar73),
                                           (float)(int)*(short *)(lVar90 + lVar73),
                                           (float)(int)*(short *)(lVar90 + 2 + lVar73),local_3c8,0);
LAB_001a7517:
                                auVar108 = pshuflw(ZEXT416(*(uint *)(lVar90 + lVar73)),
                                                   ZEXT416(*(uint *)(lVar90 + lVar73)),0x60);
                                fVar99 = (float)(auVar108._0_4_ >> 0x10);
                                fVar100 = (float)(auVar108._4_4_ >> 0x10);
                                puVar67 = local_288[0].data;
                              default:
                                goto switchD_001a73ed_default;
                              }
                              puVar67 = (uchar *)CONCAT44(local_288[0].data._4_4_,
                                                          (int)local_288[0].data + 1);
                              fVar100 = (float)(iVar72 >> 0x10);
                              fVar99 = (float)(iVar93 >> 0x10);
                              if (points != (stbtt__point *)0x0) {
                                points[(int)local_288[0].data].x = fVar99;
                                points[(int)local_288[0].data].y = fVar100;
                              }
switchD_001a73ed_default:
                              local_288[0].data = puVar67;
                              lVar73 = lVar73 + 0xe;
                            } while (uVar62 * 0xe != lVar73);
                            lVar73 = (long)(int)uVar95;
                            uVar86 = local_4a8;
                          }
                          *(int *)((long)local_460 + lVar73 * 4) =
                               (int)local_288[0].data - (int)uVar86;
                          bVar96 = true;
                        }
                        else {
                          points = (stbtt__point *)
                                   ImGui::MemAlloc((long)(int)local_288[0].data << 3);
                          if (points != (stbtt__point *)0x0) goto LAB_001a73a0;
                          points = (stbtt__point *)0x0;
                          bVar96 = false;
                        }
                        if (!bVar96) {
                          ImGui::MemFree(points);
                          iVar93 = local_430;
                          ImGui::MemFree(local_460);
                          uVar58 = 0;
                          goto LAB_001a75dc;
                        }
                        bVar96 = iVar92 == 0;
                        iVar92 = iVar92 + 1;
                        iVar93 = local_430;
                      } while (bVar96);
                    }
                    if (points != (stbtt__point *)0x0) {
                      if ((int)uVar58 < 1) {
                        size = 0x14;
                      }
                      else {
                        uVar62 = 0;
                        lVar90 = 0;
                        do {
                          lVar90 = (long)(int)lVar90 + (long)*(int *)((long)local_460 + uVar62 * 4);
                          uVar62 = uVar62 + 1;
                        } while (uVar58 != uVar62);
                        size = lVar90 * 0x14 + 0x14;
                      }
                      psVar68 = (stbtt__edge *)ImGui::MemAlloc(size);
                      if (psVar68 != (stbtt__edge *)0x0) {
                        if ((int)uVar58 < 1) {
                          uVar95 = 0;
                        }
                        else {
                          uVar62 = 0;
                          uVar95 = 0;
                          iVar92 = 0;
                          do {
                            iVar72 = *(int *)((long)local_460 + uVar62 * 4);
                            if (0 < iVar72) {
                              uVar88 = (ulong)(iVar72 - 1);
                              uVar86 = 0;
                              do {
                                iVar60 = (int)uVar88;
                                fVar99 = points[(long)iVar92 + (long)iVar60].y;
                                fVar100 = points[(long)iVar92 + uVar86].y;
                                if ((fVar99 != fVar100) || (NAN(fVar99) || NAN(fVar100))) {
                                  iVar79 = (int)uVar86;
                                  iVar93 = iVar60;
                                  if (fVar99 <= fVar100) {
                                    iVar93 = iVar79;
                                    iVar79 = iVar60;
                                  }
                                  psVar68[(int)uVar95].invert = (uint)(fVar100 < fVar99);
                                  sVar6 = points[(long)iVar92 + (long)iVar93];
                                  sVar7 = points[(long)iVar92 + (long)iVar79];
                                  psVar87 = psVar68 + (int)uVar95;
                                  psVar87->x0 = sVar6.x * (float)local_48._0_4_ + 0.0;
                                  psVar87->y0 = sVar6.y * (float)local_48._4_4_ + 0.0;
                                  psVar87->x1 = sVar7.x * fStack_40 + 0.0;
                                  psVar87->y1 = sVar7.y * fStack_3c + 0.0;
                                  uVar95 = uVar95 + 1;
                                  iVar93 = local_430;
                                }
                                uVar88 = uVar86 & 0xffffffff;
                                uVar86 = uVar86 + 1;
                              } while ((long)uVar86 < (long)*(int *)((long)local_460 + uVar62 * 4));
                            }
                            iVar92 = iVar92 + iVar72;
                            uVar62 = uVar62 + 1;
                          } while (uVar62 != uVar58);
                        }
                        local_3a0 = points;
                        local_320 = psVar68;
                        stbtt__sort_edges_quicksort(psVar68,uVar95);
                        points = local_3a0;
                        iVar92 = (int)local_400;
                        if (1 < (int)uVar95) {
                          uVar62 = 1;
                          do {
                            uVar3 = psVar68[uVar62].x0;
                            uVar8 = psVar68[uVar62].y0;
                            iVar72 = psVar68[uVar62].invert;
                            local_288[0].cursor = iVar72;
                            local_288[0].data = *(uchar **)&psVar68[uVar62].x1;
                            uVar86 = uVar62 & 0xffffffff;
                            do {
                              uVar58 = (uint)uVar86;
                              if ((int)uVar58 < 1) break;
                              fVar99 = psVar68[uVar86 - 1].y0;
                              if ((float)uVar8 < fVar99) {
                                psVar87 = psVar68 + uVar86;
                                psVar87->invert = psVar87[-1].invert;
                                fVar100 = psVar87[-1].y0;
                                fVar111 = psVar87[-1].x1;
                                fVar119 = psVar87[-1].y1;
                                psVar87->x0 = psVar87[-1].x0;
                                psVar87->y0 = fVar100;
                                psVar87->x1 = fVar111;
                                psVar87->y1 = fVar119;
                                uVar86 = (ulong)(uVar58 - 1);
                              }
                              uVar58 = (uint)uVar86;
                            } while ((float)uVar8 < fVar99);
                            if (uVar62 != uVar58) {
                              psVar68[(int)uVar58].x0 = (float)uVar3;
                              psVar68[(int)uVar58].y0 = (float)uVar8;
                              *(uchar **)&psVar68[(int)uVar58].x1 = local_288[0].data;
                              psVar68[(int)uVar58].invert = iVar72;
                            }
                            uVar62 = uVar62 + 1;
                          } while (uVar62 != uVar95);
                        }
                        local_488._0_8_ = (stbtt__active_edge *)0x0;
                        scanline = local_288;
                        if (0x40 < (int)local_42c) {
                          scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)local_42c * 8 + 4);
                          iVar92 = (int)local_400;
                        }
                        uVar58 = (int)local_3c0 - iVar92;
                        local_3c0 = (ulong)uVar58;
                        psVar68[(int)uVar95].y0 = (float)(local_3f8._0_4_ + iVar93) + 1.0;
                        if (uVar58 < 0x7fffffff) {
                          local_3a8 = local_3b8 + (long)local_3a8 * local_490 + (long)iVar59;
                          uVar58 = (int)local_3d0 - (int)local_3e0;
                          local_3d0 = (ulong)uVar58;
                          local_2d8 = (long)(int)local_42c;
                          local_36c = (float)(int)sVar57;
                          local_388 = (float *)((long)&scanline->data + local_2d8 * 4);
                          local_338 = local_388 + 1;
                          local_2c8 = local_2d8 * 4;
                          local_404 = (float)(int)local_42c;
                          local_2d0 = (long)(int)(uVar58 + 2) << 2;
                          local_398 = 0;
                          local_390 = 0;
                          local_3d8 = (undefined8 *)0x0;
                          local_3c4 = 0;
                          psVar83 = (stbtt__active_edge *)0x0;
                          do {
                            local_370 = iVar93;
                            fVar100 = (float)local_370;
                            fVar99 = fVar100 + 1.0;
                            memset(scanline,0,local_2c8);
                            memset(local_388,0,local_2d0);
                            if ((stbtt__active_edge *)local_488._0_8_ != (stbtt__active_edge *)0x0)
                            {
                              psVar69 = (stbtt__active_edge *)local_488._0_8_;
                              psVar77 = (stbtt__active_edge *)local_488;
                              do {
                                psVar78 = psVar69;
                                if (psVar69->ey <= fVar100) {
                                  psVar77->next = psVar69->next;
                                  psVar69->direction = 0.0;
                                  psVar69->next = psVar83;
                                  psVar78 = psVar77;
                                  psVar83 = psVar69;
                                }
                                psVar69 = psVar78->next;
                                psVar77 = psVar78;
                              } while (psVar69 != (stbtt__active_edge *)0x0);
                            }
                            fVar111 = psVar68->y0;
                            psVar69 = (stbtt__active_edge *)local_488._0_8_;
                            fVar119 = local_308;
                            if (fVar111 <= fVar99) {
                              bVar96 = local_430 != 0;
                              bVar97 = (int)local_390 == 0;
                              do {
                                if ((fVar111 != psVar68->y1) || (NAN(fVar111) || NAN(psVar68->y1)))
                                {
                                  if (psVar83 == (stbtt__active_edge *)0x0) {
                                    psVar69 = psVar83;
                                    if (local_3c4 == 0) {
                                      puVar71 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                      if (puVar71 == (undefined8 *)0x0) {
                                        psVar77 = (stbtt__active_edge *)0x0;
                                        goto LAB_001a80eb;
                                      }
                                      *puVar71 = local_3d8;
                                      local_3c4 = 800;
                                      local_3d8 = puVar71;
                                    }
                                    lVar90 = (long)local_3c4;
                                    local_3c4 = local_3c4 + -1;
                                    psVar77 = (stbtt__active_edge *)(local_3d8 + lVar90 * 4 + -3);
                                  }
                                  else {
                                    psVar69 = psVar83->next;
                                    psVar77 = psVar83;
                                  }
LAB_001a80eb:
                                  psVar83 = psVar69;
                                  if (psVar77 != (stbtt__active_edge *)0x0) {
                                    uVar4 = psVar68->x0;
                                    uVar9 = psVar68->y0;
                                    uVar5 = psVar68->x1;
                                    uVar10 = psVar68->y1;
                                    fVar111 = ((float)uVar5 - (float)uVar4) /
                                              ((float)uVar10 - (float)uVar9);
                                    psVar77->fdx = fVar111;
                                    psVar77->fdy = (float)(-(uint)(fVar111 != 0.0) &
                                                          (uint)(1.0 / fVar111));
                                    psVar77->fx = ((fVar100 - (float)uVar9) * fVar111 + (float)uVar4
                                                  ) - local_36c;
                                    psVar77->direction =
                                         *(float *)(&DAT_001f9f4c +
                                                   (ulong)(psVar68->invert == 0) * 4);
                                    psVar77->sy = (float)uVar9;
                                    psVar77->ey = (float)uVar10;
                                    psVar77->next = (stbtt__active_edge *)0x0;
                                    if ((float)uVar10 < fVar100 && (bVar97 && bVar96)) {
                                      psVar77->ey = fVar100;
                                    }
                                    psVar77->next = (stbtt__active_edge *)local_488._0_8_;
                                    local_488._0_8_ = psVar77;
                                  }
                                }
                                fVar111 = psVar68[1].y0;
                                psVar68 = psVar68 + 1;
                                psVar69 = (stbtt__active_edge *)local_488._0_8_;
                                fVar119 = local_308;
                              } while (fVar111 <= fVar99);
                            }
                            for (; local_308 = fVar119, psVar69 != (stbtt__active_edge *)0x0;
                                psVar69 = psVar69->next) {
                              local_308 = psVar69->fx;
                              fVar111 = psVar69->fdx;
                              if ((fVar111 != 0.0) || (NAN(fVar111))) {
                                fVar127 = fVar111 + local_308;
                                fVar121 = psVar69->sy;
                                fVar122 = (float)(~-(uint)(fVar100 < fVar121) & (uint)local_308 |
                                                 (uint)((fVar121 - fVar100) * fVar111 + local_308) &
                                                 -(uint)(fVar100 < fVar121));
                                if (0.0 <= fVar122) {
                                  fVar129 = psVar69->ey;
                                  fVar131 = (float)(-(uint)(fVar129 < fVar99) &
                                                    (uint)((fVar129 - fVar100) * fVar111 + local_308
                                                          ) |
                                                   ~-(uint)(fVar129 < fVar99) & (uint)fVar127);
                                  if (((0.0 <= fVar131) && (fVar122 < local_404)) &&
                                     (fVar131 < local_404)) {
                                    if (fVar121 <= fVar100) {
                                      fVar121 = fVar100;
                                    }
                                    iVar59 = (int)fVar122;
                                    if (fVar99 <= fVar129) {
                                      fVar129 = fVar99;
                                    }
                                    if (iVar59 == (int)fVar131) {
                                      fVar145 = (fVar129 - fVar121) * psVar69->direction;
                                      lVar90 = (long)iVar59;
                                      *(float *)((long)&scanline->data + lVar90 * 4) =
                                           ((((float)iVar59 + 1.0) - fVar131) +
                                           (((float)iVar59 + 1.0) - fVar122)) * 0.5 * fVar145 +
                                           *(float *)((long)&scanline->data + lVar90 * 4);
                                    }
                                    else {
                                      fVar111 = psVar69->fdy;
                                      fVar133 = fVar131;
                                      if (fVar131 < fVar122) {
                                        fVar143 = fVar100 - fVar121;
                                        fVar121 = (fVar100 - fVar129) + fVar99;
                                        fVar111 = -fVar111;
                                        local_308 = fVar127;
                                        fVar133 = fVar122;
                                        fVar122 = fVar131;
                                        fVar129 = fVar143 + fVar99;
                                      }
                                      uVar58 = (uint)fVar122;
                                      iVar93 = (int)fVar133;
                                      iVar59 = uVar58 + 1;
                                      fVar131 = ((float)iVar59 - local_308) * fVar111 + fVar100;
                                      fVar143 = (float)(int)fVar133;
                                      fVar127 = fVar99;
                                      if (fVar131 <= fVar99) {
                                        fVar127 = fVar131;
                                      }
                                      fVar145 = psVar69->direction;
                                      fVar147 = (fVar127 - fVar121) * fVar145;
                                      fVar131 = (fVar143 - local_308) * fVar111 + fVar100;
                                      *(float *)((long)&scanline->data + (long)(int)uVar58 * 4) =
                                           ((float)iVar59 - fVar122) * fVar147 * 0.5 +
                                           *(float *)((long)&scanline->data + (long)(int)uVar58 * 4)
                                      ;
                                      if ((fVar99 < fVar131) &&
                                         (fVar131 = fVar99, iVar93 - iVar59 != 0)) {
                                        fVar111 = (fVar99 - fVar127) / (float)(iVar93 - iVar59);
                                      }
                                      if (iVar59 < iVar93) {
                                        lVar90 = 0;
                                        do {
                                          *(float *)((long)&scanline->data + (iVar59 + lVar90) * 4)
                                               = fVar111 * fVar145 * 0.5 + fVar147 +
                                                 *(float *)((long)&scanline->data +
                                                           (iVar59 + lVar90) * 4);
                                          fVar147 = fVar147 + fVar111 * fVar145;
                                          lVar90 = lVar90 + 1;
                                        } while (~uVar58 + iVar93 != (int)lVar90);
                                      }
                                      lVar90 = (long)iVar93;
                                      *(float *)((long)&scanline->data + lVar90 * 4) =
                                           (((fVar143 + 1.0) - fVar133) +
                                           ((fVar143 + 1.0) - fVar143)) * 0.5 * (fVar129 - fVar131)
                                           * fVar145 + fVar147 +
                                           *(float *)((long)&scanline->data + lVar90 * 4);
                                      fVar145 = (fVar129 - fVar121) * fVar145;
                                    }
                                    local_338[lVar90] = fVar145 + local_338[lVar90];
                                    goto LAB_001a7f5f;
                                  }
                                }
                                if ((uint)local_3d0 < 0x7fffffff) {
                                  uStack_304 = 0;
                                  uStack_300 = 0;
                                  uStack_2fc = 0;
                                  fVar121 = fVar100;
                                  local_3f8 = ZEXT416((uint)fVar127);
                                  local_368 = fVar111;
                                  uVar58 = 0;
                                  do {
                                    fVar119 = (float)(int)uVar58;
                                    uVar95 = uVar58 + 1;
                                    fVar122 = (float)(int)uVar95;
                                    fVar111 = (fVar119 - local_308) / local_368 + fVar121;
                                    fVar127 = (fVar122 - local_308) / local_368 + fVar121;
                                    local_4a8 = CONCAT44(local_4a8._4_4_,fVar111);
                                    local_478._0_4_ = fVar119;
                                    fVar129 = local_3f8._0_4_;
                                    fVar100 = fVar121;
                                    if ((fVar119 <= local_308) || (fVar129 <= fVar122)) {
                                      if ((fVar119 <= fVar129) || (local_308 <= fVar122)) {
                                        fVar131 = local_308;
                                        if (((fVar119 <= local_308) || (fVar129 <= fVar119)) &&
                                           ((fVar119 <= fVar129 || (local_308 <= fVar119)))) {
                                          fVar111 = local_308;
                                          if (((local_308 < fVar122) && (fVar122 < fVar129)) ||
                                             ((fVar129 < fVar122 && (fVar122 < local_308))))
                                          goto LAB_001a7c12;
                                          goto LAB_001a7cc6;
                                        }
                                      }
                                      else {
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,uVar58,psVar69,local_308,
                                                   fVar121,fVar122,fVar127);
                                        fVar131 = fVar122;
                                        fVar111 = (float)local_4a8;
                                        fVar119 = (float)local_478._0_4_;
                                        fVar121 = fVar127;
                                      }
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,uVar58,psVar69,fVar131,fVar121,
                                                 fVar119,fVar111);
                                      fVar111 = (float)local_478._0_4_;
                                      fVar121 = (float)local_4a8;
                                    }
                                    else {
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,uVar58,psVar69,local_308,fVar121,
                                                 fVar119,fVar111);
                                      fVar111 = (float)local_478._0_4_;
                                      fVar121 = (float)local_4a8;
LAB_001a7c12:
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,uVar58,psVar69,fVar111,fVar121,
                                                 fVar122,fVar127);
                                      fVar111 = fVar122;
                                      fVar121 = fVar127;
                                    }
LAB_001a7cc6:
                                    stbtt__handle_clipped_edge
                                              ((float *)scanline,uVar58,psVar69,fVar111,fVar121,
                                               local_3f8._0_4_,fVar99);
                                    fVar121 = fVar100;
                                    fVar119 = local_308;
                                    uVar58 = uVar95;
                                  } while (local_42c != uVar95);
                                }
                              }
                              else if (local_308 < local_404) {
                                if (0.0 <= local_308) {
                                  iVar59 = (int)local_308;
                                  uStack_304 = 0;
                                  uStack_300 = 0;
                                  uStack_2fc = 0;
                                  stbtt__handle_clipped_edge
                                            ((float *)scanline,iVar59,psVar69,local_308,fVar100,
                                             local_308,fVar99);
                                  iVar59 = iVar59 + 1;
                                  fVar111 = local_308;
                                }
                                else {
                                  iVar59 = 0;
                                  fVar111 = local_308;
                                  local_308 = fVar119;
                                }
                                stbtt__handle_clipped_edge
                                          (local_388,iVar59,psVar69,fVar111,fVar100,fVar111,fVar99);
                                fVar119 = local_308;
                              }
LAB_001a7f5f:
                              local_308 = fVar119;
                              fVar119 = local_308;
                            }
                            uVar58 = (uint)DAT_001ec5e0;
                            psVar69 = (stbtt__active_edge *)local_488._0_8_;
                            if ((uint)local_3d0 < 0x7fffffff) {
                              fVar99 = 0.0;
                              psVar70 = scanline;
                              uVar62 = local_398;
                              lVar90 = local_2d8;
                              do {
                                fVar99 = fVar99 + *(float *)((long)&psVar70->data + local_2d8 * 4);
                                iVar59 = (int)((float)((uint)(*(float *)&psVar70->data + fVar99) &
                                                      uVar58) * 255.0 + 0.5);
                                uVar85 = (uchar)iVar59;
                                if (0xfe < iVar59) {
                                  uVar85 = 0xff;
                                }
                                local_3a8[(int)uVar62] = uVar85;
                                uVar62 = (ulong)((int)uVar62 + 1);
                                psVar70 = (stbtt__buf *)((long)&psVar70->data + 4);
                                lVar90 = lVar90 + -1;
                              } while (lVar90 != 0);
                            }
                            for (; psVar69 != (stbtt__active_edge *)0x0; psVar69 = psVar69->next) {
                              psVar69->fx = psVar69->fdx + psVar69->fx;
                            }
                            iVar59 = (int)local_390;
                            local_390 = (ulong)(iVar59 + 1);
                            local_398 = (ulong)(uint)((int)local_398 + local_374);
                            iVar93 = local_370 + 1;
                            puVar71 = local_3d8;
                            psVar87 = local_320;
                            points = local_3a0;
                          } while (iVar59 != (int)local_3c0);
                        }
                        else {
                          local_3d8 = (undefined8 *)0x0;
                          puVar71 = local_3d8;
                          psVar87 = local_320;
                        }
                        while (psVar68 = local_320, local_320 = psVar87,
                              puVar71 != (undefined8 *)0x0) {
                          puVar15 = (undefined8 *)*puVar71;
                          ImGui::MemFree(puVar71);
                          puVar71 = puVar15;
                          psVar87 = local_320;
                          local_320 = psVar68;
                        }
                        if (scanline != local_288) {
                          ImGui::MemFree(scanline);
                        }
                        ImGui::MemFree(psVar68);
                      }
                      ImGui::MemFree(local_460);
                      ImGui::MemFree(points);
                    }
                  }
                }
                ImGui::MemFree((void *)CONCAT44(local_410._4_4_,(stbtt_uint32)local_410));
                if (1 < (byte)local_328) {
                  iVar59 = *(int *)(local_3b0 + 4);
                  local_288[0].data = (uchar *)0x0;
                  local_4a8 = CONCAT44(local_4a8._4_4_,*(int *)(local_3b0 + 8));
                  if (0 < *(int *)(local_3b0 + 8)) {
                    puVar67 = local_3b8 +
                              *(int *)(local_3b0 + 0x10) * local_490 +
                              (long)*(int *)(local_3b0 + 0xc);
                    iVar92 = iVar59 - (int)local_3e0;
                    uVar62 = (ulong)(iVar92 + 1);
                    iVar93 = 0;
                    do {
                      uVar86 = local_328;
                      memset(local_288,0,local_328);
                      switch((int)uVar86) {
                      case 2:
                        if (iVar92 < 0) {
LAB_001a8454:
                          uVar88 = 0;
                          uVar86 = 0;
                        }
                        else {
                          uVar88 = 0;
                          uVar86 = 0;
                          do {
                            bVar98 = puVar67[uVar88];
                            bVar104 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar88 & 7)
                                               );
                            *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar88 + 2 & 7)) =
                                 bVar98;
                            uVar58 = (int)uVar86 + ((uint)bVar98 - (uint)bVar104);
                            uVar86 = (ulong)uVar58;
                            puVar67[uVar88] = (uchar)(uVar58 >> 1);
                            uVar88 = uVar88 + 1;
                          } while (uVar62 != uVar88);
                        }
                        break;
                      case 3:
                        if (iVar92 < 0) goto LAB_001a8454;
                        uVar88 = 0;
                        uVar86 = 0;
                        do {
                          bVar98 = puVar67[uVar88];
                          bVar104 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar88 & 7));
                          *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar88 + 3 & 7)) =
                               bVar98;
                          uVar86 = (ulong)((int)uVar86 + ((uint)bVar98 - (uint)bVar104));
                          puVar67[uVar88] = (uchar)(uVar86 / 3);
                          uVar88 = uVar88 + 1;
                        } while (uVar62 != uVar88);
                        break;
                      case 4:
                        if (iVar92 < 0) goto LAB_001a8454;
                        uVar88 = 0;
                        uVar86 = 0;
                        do {
                          bVar98 = puVar67[uVar88];
                          uVar81 = (ulong)((uint)uVar88 & 7);
                          bVar104 = *(byte *)((long)&local_288[0].data + uVar81);
                          *(byte *)((long)&local_288[0].data + (uVar81 ^ 4)) = bVar98;
                          uVar58 = (int)uVar86 + ((uint)bVar98 - (uint)bVar104);
                          uVar86 = (ulong)uVar58;
                          puVar67[uVar88] = (uchar)(uVar58 >> 2);
                          uVar88 = uVar88 + 1;
                        } while (uVar62 != uVar88);
                        break;
                      case 5:
                        if (iVar92 < 0) goto LAB_001a8454;
                        uVar88 = 0;
                        uVar86 = 0;
                        do {
                          bVar98 = puVar67[uVar88];
                          bVar104 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar88 & 7));
                          *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar88 + 5 & 7)) =
                               bVar98;
                          uVar86 = (ulong)((int)uVar86 + ((uint)bVar98 - (uint)bVar104));
                          puVar67[uVar88] = (uchar)(uVar86 / 5);
                          uVar88 = uVar88 + 1;
                        } while (uVar62 != uVar88);
                        break;
                      default:
                        if (iVar92 < 0) goto LAB_001a8454;
                        uVar88 = 0;
                        uVar86 = 0;
                        do {
                          bVar98 = puVar67[uVar88];
                          bVar104 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar88 & 7));
                          *(byte *)((long)&local_288[0].data +
                                   (ulong)((int)local_3e0 + (uint)uVar88 & 7)) = bVar98;
                          uVar86 = (ulong)((int)uVar86 + ((uint)bVar98 - (uint)bVar104));
                          puVar67[uVar88] = (uchar)(uVar86 / (local_3e0 & 0xffffffff));
                          uVar88 = uVar88 + 1;
                        } while (uVar62 != uVar88);
                      }
                      if ((int)uVar88 < iVar59) {
                        uVar88 = uVar88 & 0xffffffff;
                        do {
                          uVar86 = (ulong)((int)uVar86 -
                                          (uint)*(byte *)((long)&local_288[0].data +
                                                         (ulong)((uint)uVar88 & 7)));
                          puVar67[uVar88] = (uchar)(uVar86 / (local_3e0 & 0xffffffff));
                          uVar88 = uVar88 + 1;
                        } while ((int)uVar88 < iVar59);
                      }
                      puVar67 = puVar67 + local_490;
                      iVar93 = iVar93 + 1;
                    } while ((float)iVar93 != (float)local_4a8);
                  }
                }
                if (1 < (byte)local_330) {
                  iVar59 = *(int *)(local_3b0 + 8);
                  local_288[0].data = (uchar *)0x0;
                  local_4a8 = CONCAT44(local_4a8._4_4_,*(int *)(local_3b0 + 4));
                  if (0 < *(int *)(local_3b0 + 4)) {
                    pbVar84 = local_3b8 +
                              *(int *)(local_3b0 + 0x10) * local_490 +
                              (long)*(int *)(local_3b0 + 0xc);
                    iVar92 = iVar59 - (int)local_400;
                    uVar62 = (ulong)(iVar92 + 1);
                    iVar93 = 0;
                    do {
                      uVar86 = local_330;
                      memset(local_288,0,local_330);
                      switch((int)uVar86) {
                      case 2:
                        if (iVar92 < 0) {
LAB_001a86d4:
                          uVar88 = 0;
                          uVar86 = 0;
                        }
                        else {
                          uVar88 = 0;
                          uVar86 = 0;
                          pbVar89 = pbVar84;
                          do {
                            bVar98 = *pbVar89;
                            bVar104 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar88 & 7)
                                               );
                            *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar88 + 2 & 7)) =
                                 bVar98;
                            uVar58 = (int)uVar86 + ((uint)bVar98 - (uint)bVar104);
                            uVar86 = (ulong)uVar58;
                            *pbVar89 = (byte)(uVar58 >> 1);
                            uVar88 = uVar88 + 1;
                            pbVar89 = pbVar89 + local_490;
                          } while (uVar62 != uVar88);
                        }
                        break;
                      case 3:
                        if (iVar92 < 0) goto LAB_001a86d4;
                        uVar88 = 0;
                        uVar86 = 0;
                        pbVar89 = pbVar84;
                        do {
                          bVar98 = *pbVar89;
                          bVar104 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar88 & 7));
                          *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar88 + 3 & 7)) =
                               bVar98;
                          uVar86 = (ulong)((int)uVar86 + ((uint)bVar98 - (uint)bVar104));
                          *pbVar89 = (byte)(uVar86 / 3);
                          uVar88 = uVar88 + 1;
                          pbVar89 = pbVar89 + local_490;
                        } while (uVar62 != uVar88);
                        break;
                      case 4:
                        if (iVar92 < 0) goto LAB_001a86d4;
                        uVar88 = 0;
                        uVar86 = 0;
                        pbVar89 = pbVar84;
                        do {
                          bVar98 = *pbVar89;
                          uVar81 = (ulong)((uint)uVar88 & 7);
                          bVar104 = *(byte *)((long)&local_288[0].data + uVar81);
                          *(byte *)((long)&local_288[0].data + (uVar81 ^ 4)) = bVar98;
                          uVar58 = (int)uVar86 + ((uint)bVar98 - (uint)bVar104);
                          uVar86 = (ulong)uVar58;
                          *pbVar89 = (byte)(uVar58 >> 2);
                          uVar88 = uVar88 + 1;
                          pbVar89 = pbVar89 + local_490;
                        } while (uVar62 != uVar88);
                        break;
                      case 5:
                        if (iVar92 < 0) goto LAB_001a86d4;
                        uVar88 = 0;
                        uVar86 = 0;
                        pbVar89 = pbVar84;
                        do {
                          bVar98 = *pbVar89;
                          bVar104 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar88 & 7));
                          *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar88 + 5 & 7)) =
                               bVar98;
                          uVar86 = (ulong)((int)uVar86 + ((uint)bVar98 - (uint)bVar104));
                          *pbVar89 = (byte)(uVar86 / 5);
                          uVar88 = uVar88 + 1;
                          pbVar89 = pbVar89 + local_490;
                        } while (uVar62 != uVar88);
                        break;
                      default:
                        if (iVar92 < 0) goto LAB_001a86d4;
                        uVar88 = 0;
                        uVar86 = 0;
                        pbVar89 = pbVar84;
                        do {
                          bVar98 = *pbVar89;
                          bVar104 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar88 & 7));
                          *(byte *)((long)&local_288[0].data +
                                   (ulong)((int)local_400 + (uint)uVar88 & 7)) = bVar98;
                          uVar86 = (ulong)((int)uVar86 + ((uint)bVar98 - (uint)bVar104));
                          *pbVar89 = (byte)(uVar86 / (local_400 & 0xffffffff));
                          uVar88 = uVar88 + 1;
                          pbVar89 = pbVar89 + local_490;
                        } while (uVar62 != uVar88);
                      }
                      if ((int)uVar88 < iVar59) {
                        lVar90 = (long)(int)uVar88;
                        pbVar89 = pbVar84 + local_490 * lVar90;
                        do {
                          uVar86 = (ulong)((int)uVar86 -
                                          (uint)*(byte *)((long)&local_288[0].data +
                                                         (ulong)((uint)lVar90 & 7)));
                          *pbVar89 = (byte)(uVar86 / (local_400 & 0xffffffff));
                          lVar90 = lVar90 + 1;
                          pbVar89 = pbVar89 + local_490;
                        } while (iVar59 != lVar90);
                      }
                      pbVar84 = pbVar84 + 1;
                      iVar93 = iVar93 + 1;
                    } while ((float)iVar93 != (float)local_4a8);
                  }
                }
                *(float *)(local_2e8 + 8) =
                     (float)(int)(short)((short)(local_37c << 8) + (short)local_380) *
                     (float)local_318._0_4_;
                *(ulong *)(local_2e8 + 4) =
                     CONCAT44((float)local_364 * local_68._4_4_ + local_58._4_4_,
                              (float)local_360 * local_68._0_4_ + local_58._0_4_);
                uVar136 = *(undefined8 *)(local_3b0 + 4);
                uVar162 = *(undefined8 *)(local_3b0 + 0xc);
                *local_2e8 = (short)uVar162;
                local_2e8[1] = (short)((ulong)uVar162 >> 0x20);
                iVar59 = (int)uVar136;
                auVar112._0_4_ = (int)uVar162 + iVar59;
                iVar93 = (int)((ulong)uVar136 >> 0x20);
                auVar112._4_4_ = (int)((ulong)uVar162 >> 0x20) + iVar93;
                auVar112._8_8_ = 0;
                auVar108 = pshuflw(auVar112,auVar112,0xe8);
                *(int *)(local_2e8 + 2) = auVar108._0_4_;
                *(float *)(local_2e8 + 10) =
                     (float)(local_360 + iVar59) * local_68._0_4_ + local_58._0_4_;
                *(float *)(local_2e8 + 0xc) =
                     (float)(local_364 + iVar93) * local_68._4_4_ + local_58._4_4_;
                uVar86 = (ulong)local_378;
                lVar90 = local_2f0;
                uVar62 = local_2e0;
                psVar82 = local_348;
                auVar108 = _DAT_001f9e30;
                auVar101 = _DAT_001ec3b0;
                auVar139 = local_58;
                if ((int)local_340 == 0) {
                  uVar86 = local_2e0 & 0xffffffff;
                }
              }
            }
            uVar62 = uVar62 + 1;
          } while ((long)uVar62 < (long)psVar82[1].fontstart);
        }
        fVar99 = local_2f8[local_350].RasterizerMultiply;
        if ((fVar99 != 1.0) || (NAN(fVar99))) {
          lVar90 = 0;
          auVar110 = _DAT_001f9e20;
          auVar113 = _DAT_001f9e10;
          auVar114 = _DAT_001f9e00;
          auVar116 = _DAT_001f9df0;
          do {
            auVar123 = auVar113 & auVar108 | _DAT_001f9e40;
            uVar58 = auVar113._4_4_;
            uVar95 = auVar113._8_4_;
            uVar120 = auVar113._12_4_;
            auVar139 = auVar110 & auVar108 | _DAT_001f9e40;
            uVar126 = auVar110._4_4_;
            uVar128 = auVar110._8_4_;
            uVar130 = auVar110._12_4_;
            auVar149 = auVar116 & auVar108 | _DAT_001f9e40;
            uVar142 = auVar116._4_4_;
            uVar144 = auVar116._8_4_;
            uVar146 = auVar116._12_4_;
            auVar165 = auVar114 & auVar108 | _DAT_001f9e40;
            uVar153 = auVar114._4_4_;
            uVar155 = auVar114._8_4_;
            uVar157 = auVar114._12_4_;
            fVar148 = (((float)(auVar114._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                      auVar165._0_4_) * fVar99;
            fVar154 = (((float)(uVar153 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar165._4_4_) *
                      fVar99;
            fVar156 = (((float)(uVar155 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar165._8_4_) *
                      fVar99;
            fVar158 = (((float)(uVar157 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar165._12_4_) *
                      fVar99;
            fVar133 = (((float)(auVar116._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                      auVar149._0_4_) * fVar99;
            fVar143 = (((float)(uVar142 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar149._4_4_) *
                      fVar99;
            fVar145 = (((float)(uVar144 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar149._8_4_) *
                      fVar99;
            fVar147 = (((float)(uVar146 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar149._12_4_) *
                      fVar99;
            fVar122 = (((float)(auVar110._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                      auVar139._0_4_) * fVar99;
            fVar127 = (((float)(uVar126 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar139._4_4_) *
                      fVar99;
            fVar129 = (((float)(uVar128 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar139._8_4_) *
                      fVar99;
            fVar131 = (((float)(uVar130 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar139._12_4_) *
                      fVar99;
            fVar100 = (((float)(auVar113._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                      auVar123._0_4_) * fVar99;
            fVar111 = (((float)(uVar58 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar123._4_4_) *
                      fVar99;
            fVar119 = (((float)(uVar95 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar123._8_4_) *
                      fVar99;
            fVar121 = (((float)(uVar120 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar123._12_4_) *
                      fVar99;
            auVar118._0_4_ = (int)fVar100;
            auVar118._4_4_ = (int)fVar111;
            auVar118._8_4_ = (int)fVar119;
            auVar118._12_4_ = (int)fVar121;
            auVar171._0_4_ = auVar118._0_4_ >> 0x1f;
            auVar171._4_4_ = auVar118._4_4_ >> 0x1f;
            auVar171._8_4_ = auVar118._8_4_ >> 0x1f;
            auVar171._12_4_ = auVar118._12_4_ >> 0x1f;
            auVar117._0_4_ = (int)(fVar100 - 2.1474836e+09);
            auVar117._4_4_ = (int)(fVar111 - 2.1474836e+09);
            auVar117._8_4_ = (int)(fVar119 - 2.1474836e+09);
            auVar117._12_4_ = (int)(fVar121 - 2.1474836e+09);
            auVar118 = auVar117 & auVar171 | auVar118;
            auVar125._0_4_ = (int)fVar122;
            auVar125._4_4_ = (int)fVar127;
            auVar125._8_4_ = (int)fVar129;
            auVar125._12_4_ = (int)fVar131;
            auVar172._0_4_ = auVar125._0_4_ >> 0x1f;
            auVar172._4_4_ = auVar125._4_4_ >> 0x1f;
            auVar172._8_4_ = auVar125._8_4_ >> 0x1f;
            auVar172._12_4_ = auVar125._12_4_ >> 0x1f;
            auVar124._0_4_ = (int)(fVar122 - 2.1474836e+09);
            auVar124._4_4_ = (int)(fVar127 - 2.1474836e+09);
            auVar124._8_4_ = (int)(fVar129 - 2.1474836e+09);
            auVar124._12_4_ = (int)(fVar131 - 2.1474836e+09);
            auVar125 = auVar124 & auVar172 | auVar125;
            auVar167._0_4_ = (int)fVar133;
            auVar167._4_4_ = (int)fVar143;
            auVar167._8_4_ = (int)fVar145;
            auVar167._12_4_ = (int)fVar147;
            auVar175._0_4_ = auVar167._0_4_ >> 0x1f;
            auVar175._4_4_ = auVar167._4_4_ >> 0x1f;
            auVar175._8_4_ = auVar167._8_4_ >> 0x1f;
            auVar175._12_4_ = auVar167._12_4_ >> 0x1f;
            auVar166._0_4_ = (int)(fVar133 - 2.1474836e+09);
            auVar166._4_4_ = (int)(fVar143 - 2.1474836e+09);
            auVar166._8_4_ = (int)(fVar145 - 2.1474836e+09);
            auVar166._12_4_ = (int)(fVar147 - 2.1474836e+09);
            auVar167 = auVar166 & auVar175 | auVar167;
            auVar151._0_4_ = (int)fVar148;
            auVar151._4_4_ = (int)fVar154;
            auVar151._8_4_ = (int)fVar156;
            auVar151._12_4_ = (int)fVar158;
            auVar173._0_4_ = auVar151._0_4_ >> 0x1f;
            auVar173._4_4_ = auVar151._4_4_ >> 0x1f;
            auVar173._8_4_ = auVar151._8_4_ >> 0x1f;
            auVar173._12_4_ = auVar151._12_4_ >> 0x1f;
            auVar150._0_4_ = (int)(fVar148 - 2.1474836e+09);
            auVar150._4_4_ = (int)(fVar154 - 2.1474836e+09);
            auVar150._8_4_ = (int)(fVar156 - 2.1474836e+09);
            auVar150._12_4_ = (int)(fVar158 - 2.1474836e+09);
            auVar151 = auVar150 & auVar173 | auVar151;
            auVar123 = auVar151 ^ auVar101;
            auVar140._0_4_ = -(uint)(auVar123._0_4_ < -0x7fffff01);
            auVar140._4_4_ = -(uint)(auVar123._4_4_ < -0x7fffff01);
            auVar140._8_4_ = -(uint)(auVar123._8_4_ < -0x7fffff01);
            auVar140._12_4_ = -(uint)(auVar123._12_4_ < -0x7fffff01);
            auVar123 = ~auVar140 & _DAT_001f9e90 | auVar151 & auVar140;
            auVar139 = auVar167 ^ auVar101;
            auVar174._0_4_ = -(uint)(auVar139._0_4_ < -0x7fffff01);
            auVar174._4_4_ = -(uint)(auVar139._4_4_ < -0x7fffff01);
            auVar174._8_4_ = -(uint)(auVar139._8_4_ < -0x7fffff01);
            auVar174._12_4_ = -(uint)(auVar139._12_4_ < -0x7fffff01);
            auVar139 = ~auVar174 & _DAT_001f9e90 | auVar167 & auVar174;
            sVar30 = auVar123._0_2_;
            cVar16 = (0 < sVar30) * (sVar30 < 0x100) * auVar123[0] - (0xff < sVar30);
            sVar30 = auVar123._2_2_;
            sVar132 = CONCAT11((0 < sVar30) * (sVar30 < 0x100) * auVar123[2] - (0xff < sVar30),
                               cVar16);
            sVar30 = auVar123._4_2_;
            cVar105 = (0 < sVar30) * (sVar30 < 0x100) * auVar123[4] - (0xff < sVar30);
            sVar30 = auVar123._6_2_;
            uVar134 = CONCAT13((0 < sVar30) * (sVar30 < 0x100) * auVar123[6] - (0xff < sVar30),
                               CONCAT12(cVar105,sVar132));
            sVar30 = auVar123._8_2_;
            cVar17 = (0 < sVar30) * (sVar30 < 0x100) * auVar123[8] - (0xff < sVar30);
            sVar30 = auVar123._10_2_;
            uVar135 = CONCAT15((0 < sVar30) * (sVar30 < 0x100) * auVar123[10] - (0xff < sVar30),
                               CONCAT14(cVar17,uVar134));
            sVar30 = auVar123._12_2_;
            cVar18 = (0 < sVar30) * (sVar30 < 0x100) * auVar123[0xc] - (0xff < sVar30);
            sVar30 = auVar123._14_2_;
            uVar136 = CONCAT17((0 < sVar30) * (sVar30 < 0x100) * auVar123[0xe] - (0xff < sVar30),
                               CONCAT16(cVar18,uVar135));
            sVar30 = auVar139._0_2_;
            cVar19 = (0 < sVar30) * (sVar30 < 0x100) * auVar139[0] - (0xff < sVar30);
            sVar30 = auVar139._2_2_;
            auVar137._0_10_ =
                 CONCAT19((0 < sVar30) * (sVar30 < 0x100) * auVar139[2] - (0xff < sVar30),
                          CONCAT18(cVar19,uVar136));
            sVar30 = auVar139._4_2_;
            cVar20 = (0 < sVar30) * (sVar30 < 0x100) * auVar139[4] - (0xff < sVar30);
            auVar137[10] = cVar20;
            sVar30 = auVar139._6_2_;
            auVar137[0xb] = (0 < sVar30) * (sVar30 < 0x100) * auVar139[6] - (0xff < sVar30);
            sVar30 = auVar139._8_2_;
            cVar21 = (0 < sVar30) * (sVar30 < 0x100) * auVar139[8] - (0xff < sVar30);
            auVar138[0xc] = cVar21;
            auVar138._0_12_ = auVar137;
            sVar30 = auVar139._10_2_;
            auVar138[0xd] = (0 < sVar30) * (sVar30 < 0x100) * auVar139[10] - (0xff < sVar30);
            sVar30 = auVar139._12_2_;
            cVar106 = (0 < sVar30) * (sVar30 < 0x100) * auVar139[0xc] - (0xff < sVar30);
            auVar141[0xe] = cVar106;
            auVar141._0_14_ = auVar138;
            sVar30 = auVar139._14_2_;
            auVar141[0xf] = (0 < sVar30) * (sVar30 < 0x100) * auVar139[0xe] - (0xff < sVar30);
            auVar123 = auVar125 ^ auVar101;
            auVar168._0_4_ = -(uint)(auVar123._0_4_ < -0x7fffff01);
            auVar168._4_4_ = -(uint)(auVar123._4_4_ < -0x7fffff01);
            auVar168._8_4_ = -(uint)(auVar123._8_4_ < -0x7fffff01);
            auVar168._12_4_ = -(uint)(auVar123._12_4_ < -0x7fffff01);
            auVar139 = ~auVar168 & _DAT_001f9e90 | auVar125 & auVar168;
            auVar123 = auVar118 ^ auVar101;
            auVar152._0_4_ = -(uint)(auVar123._0_4_ < -0x7fffff01);
            auVar152._4_4_ = -(uint)(auVar123._4_4_ < -0x7fffff01);
            auVar152._8_4_ = -(uint)(auVar123._8_4_ < -0x7fffff01);
            auVar152._12_4_ = -(uint)(auVar123._12_4_ < -0x7fffff01);
            auVar123 = ~auVar152 & _DAT_001f9e90 | auVar118 & auVar152;
            sVar30 = auVar139._0_2_;
            cVar22 = (0 < sVar30) * (sVar30 < 0x100) * auVar139[0] - (0xff < sVar30);
            sVar30 = auVar139._2_2_;
            sVar159 = CONCAT11((0 < sVar30) * (sVar30 < 0x100) * auVar139[2] - (0xff < sVar30),
                               cVar22);
            sVar30 = auVar139._4_2_;
            cVar23 = (0 < sVar30) * (sVar30 < 0x100) * auVar139[4] - (0xff < sVar30);
            sVar30 = auVar139._6_2_;
            uVar160 = CONCAT13((0 < sVar30) * (sVar30 < 0x100) * auVar139[6] - (0xff < sVar30),
                               CONCAT12(cVar23,sVar159));
            sVar30 = auVar139._8_2_;
            cVar24 = (0 < sVar30) * (sVar30 < 0x100) * auVar139[8] - (0xff < sVar30);
            sVar30 = auVar139._10_2_;
            uVar161 = CONCAT15((0 < sVar30) * (sVar30 < 0x100) * auVar139[10] - (0xff < sVar30),
                               CONCAT14(cVar24,uVar160));
            sVar30 = auVar139._12_2_;
            cVar25 = (0 < sVar30) * (sVar30 < 0x100) * auVar139[0xc] - (0xff < sVar30);
            sVar30 = auVar139._14_2_;
            uVar162 = CONCAT17((0 < sVar30) * (sVar30 < 0x100) * auVar139[0xe] - (0xff < sVar30),
                               CONCAT16(cVar25,uVar161));
            sVar30 = auVar123._0_2_;
            cVar26 = (0 < sVar30) * (sVar30 < 0x100) * auVar123[0] - (0xff < sVar30);
            sVar30 = auVar123._2_2_;
            auVar163._0_10_ =
                 CONCAT19((0 < sVar30) * (sVar30 < 0x100) * auVar123[2] - (0xff < sVar30),
                          CONCAT18(cVar26,uVar162));
            sVar30 = auVar123._4_2_;
            cVar27 = (0 < sVar30) * (sVar30 < 0x100) * auVar123[4] - (0xff < sVar30);
            auVar163[10] = cVar27;
            sVar30 = auVar123._6_2_;
            auVar163[0xb] = (0 < sVar30) * (sVar30 < 0x100) * auVar123[6] - (0xff < sVar30);
            sVar30 = auVar123._8_2_;
            cVar28 = (0 < sVar30) * (sVar30 < 0x100) * auVar123[8] - (0xff < sVar30);
            auVar164[0xc] = cVar28;
            auVar164._0_12_ = auVar163;
            sVar30 = auVar123._10_2_;
            auVar164[0xd] = (0 < sVar30) * (sVar30 < 0x100) * auVar123[10] - (0xff < sVar30);
            sVar30 = auVar123._12_2_;
            cVar29 = (0 < sVar30) * (sVar30 < 0x100) * auVar123[0xc] - (0xff < sVar30);
            auVar169[0xe] = cVar29;
            auVar169._0_14_ = auVar164;
            sVar30 = auVar123._14_2_;
            auVar169[0xf] = (0 < sVar30) * (sVar30 < 0x100) * auVar123[0xe] - (0xff < sVar30);
            sVar30 = (short)((uint)uVar160 >> 0x10);
            auVar170[1] = (0 < sVar30) * (sVar30 < 0x100) * cVar23 - (0xff < sVar30);
            auVar170[0] = (0 < sVar159) * (sVar159 < 0x100) * cVar22 - (0xff < sVar159);
            sVar30 = (short)((uint6)uVar161 >> 0x20);
            auVar170[2] = (0 < sVar30) * (sVar30 < 0x100) * cVar24 - (0xff < sVar30);
            sVar30 = (short)((ulong)uVar162 >> 0x30);
            auVar170[3] = (0 < sVar30) * (sVar30 < 0x100) * cVar25 - (0xff < sVar30);
            sVar30 = (short)((unkuint10)auVar163._0_10_ >> 0x40);
            auVar170[4] = (0 < sVar30) * (sVar30 < 0x100) * cVar26 - (0xff < sVar30);
            sVar30 = auVar163._10_2_;
            auVar170[5] = (0 < sVar30) * (sVar30 < 0x100) * cVar27 - (0xff < sVar30);
            sVar30 = auVar164._12_2_;
            auVar170[6] = (0 < sVar30) * (sVar30 < 0x100) * cVar28 - (0xff < sVar30);
            sVar30 = auVar169._14_2_;
            auVar170[7] = (0 < sVar30) * (sVar30 < 0x100) * cVar29 - (0xff < sVar30);
            auVar170[8] = (0 < sVar132) * (sVar132 < 0x100) * cVar16 - (0xff < sVar132);
            sVar30 = (short)((uint)uVar134 >> 0x10);
            auVar170[9] = (0 < sVar30) * (sVar30 < 0x100) * cVar105 - (0xff < sVar30);
            sVar30 = (short)((uint6)uVar135 >> 0x20);
            auVar170[10] = (0 < sVar30) * (sVar30 < 0x100) * cVar17 - (0xff < sVar30);
            sVar30 = (short)((ulong)uVar136 >> 0x30);
            auVar170[0xb] = (0 < sVar30) * (sVar30 < 0x100) * cVar18 - (0xff < sVar30);
            sVar30 = (short)((unkuint10)auVar137._0_10_ >> 0x40);
            auVar170[0xc] = (0 < sVar30) * (sVar30 < 0x100) * cVar19 - (0xff < sVar30);
            sVar30 = auVar137._10_2_;
            auVar170[0xd] = (0 < sVar30) * (sVar30 < 0x100) * cVar20 - (0xff < sVar30);
            sVar30 = auVar138._12_2_;
            auVar170[0xe] = (0 < sVar30) * (sVar30 < 0x100) * cVar21 - (0xff < sVar30);
            sVar30 = auVar141._14_2_;
            auVar170[0xf] = (0 < sVar30) * (sVar30 < 0x100) * cVar106 - (0xff < sVar30);
            *(undefined1 (*) [16])((long)&local_288[0].data + lVar90) = auVar170;
            lVar90 = lVar90 + 0x10;
            auVar110._0_4_ = auVar110._0_4_ + 0x10;
            auVar110._4_4_ = uVar126 + 0x10;
            auVar110._8_4_ = uVar128 + 0x10;
            auVar110._12_4_ = uVar130 + 0x10;
            auVar113._0_4_ = auVar113._0_4_ + 0x10;
            auVar113._4_4_ = uVar58 + 0x10;
            auVar113._8_4_ = uVar95 + 0x10;
            auVar113._12_4_ = uVar120 + 0x10;
            auVar114._0_4_ = auVar114._0_4_ + 0x10;
            auVar114._4_4_ = uVar153 + 0x10;
            auVar114._8_4_ = uVar155 + 0x10;
            auVar114._12_4_ = uVar157 + 0x10;
            auVar116._0_4_ = auVar116._0_4_ + 0x10;
            auVar116._4_4_ = uVar142 + 0x10;
            auVar116._8_4_ = uVar144 + 0x10;
            auVar116._12_4_ = uVar146 + 0x10;
          } while (lVar90 != 0x100);
          if (0 < psVar82[1].cff.cursor) {
            lVar73._0_4_ = psVar82[1].hmtx;
            lVar73._4_4_ = psVar82[1].kern;
            iVar59 = 0;
            do {
              if ((*(int *)(lVar73 + 0x14) != 0) && (0 < *(int *)(lVar73 + 8))) {
                iVar93 = *(int *)(lVar73 + 4);
                iVar92 = atlas->TexWidth;
                pbVar84 = atlas->TexPixelsAlpha8 +
                          (long)*(int *)(lVar73 + 0x10) * (long)iVar92 +
                          (long)*(int *)(lVar73 + 0xc);
                iVar72 = *(int *)(lVar73 + 8);
                do {
                  iVar60 = iVar93 + 1;
                  if (0 < iVar93) {
                    do {
                      *pbVar84 = *(byte *)((long)&local_288[0].data + (ulong)*pbVar84);
                      pbVar84 = pbVar84 + 1;
                      iVar60 = iVar60 + -1;
                    } while (1 < iVar60);
                  }
                  pbVar84 = pbVar84 + ((long)iVar92 - (long)iVar93);
                  bVar96 = 1 < iVar72;
                  iVar72 = iVar72 + -1;
                } while (bVar96);
              }
              iVar59 = iVar59 + 1;
              lVar73 = lVar73 + 0x18;
            } while (iVar59 < psVar82[1].cff.cursor);
          }
        }
        psVar82[1].hmtx = 0;
        psVar82[1].kern = 0;
      }
      lVar90 = local_350 + 1;
    } while (lVar90 < iVar178);
  }
  ImGui::MemFree(local_418);
  ImGui::MemFree(local_358);
  uVar136 = local_458._8_8_;
  if ((void *)local_458._8_8_ != (void *)0x0) {
    auVar38._8_8_ = 0;
    auVar38._0_8_ = local_458._8_8_;
    local_458 = auVar38 << 0x40;
    ImGui::MemFree((void *)uVar136);
    local_458._8_8_ = 0;
  }
  if (0 < iVar178) {
    lVar90 = 0;
    pvVar61 = __dest;
    do {
      lVar66 = lVar90 * 0x110;
      pIVar91 = (atlas->ConfigData).Data;
      lVar73 = *(long *)((long)pvVar61 + lVar66 + 8);
      local_478._0_8_ = lVar66;
      lVar66 = (long)*(int *)((long)pvVar61 + lVar66 + 0x24);
      uVar58 = (int)(short)((ushort)*(byte *)(lVar73 + 4 + lVar66) << 8) |
               (uint)*(byte *)(lVar73 + 5 + lVar66);
      uVar95 = (int)(short)((ushort)*(byte *)(lVar73 + 6 + lVar66) << 8) |
               (uint)*(byte *)(lVar73 + 7 + lVar66);
      pIVar13 = pIVar91[lVar90].DstFont;
      fVar99 = pIVar91[lVar90].SizePixels / (float)(int)(uVar58 - uVar95);
      local_4a8 = CONCAT44(local_4a8._4_4_,fVar99);
      __dest = pvVar61;
      fVar99 = ceilf((float)(int)uVar58 * fVar99);
      fVar100 = (float)(int)uVar95 * (float)local_4a8;
      if (0.0 <= fVar100) {
LAB_001a8c6f:
        iVar59 = (int)fVar100;
      }
      else {
        if ((fVar100 == (float)(int)fVar100) && (!NAN(fVar100) && !NAN((float)(int)fVar100)))
        goto LAB_001a8c6f;
        iVar59 = (int)fVar100 + -1;
      }
      pIVar91 = pIVar91 + lVar90;
      if (pIVar91->MergeMode == false) {
        ImFont::ClearOutputData(pIVar13);
        pIVar13->FontSize = pIVar91->SizePixels;
        pIVar13->ContainerAtlas = atlas;
        pIVar13->Ascent = fVar99;
        pIVar13->Descent = (float)iVar59;
      }
      uVar136 = local_478._0_8_;
      if (0 < *(int *)((long)pvVar61 + local_478._0_8_ + 0xe8)) {
        local_4a8 = CONCAT44(local_4a8._4_4_,(pIVar91->GlyphOffset).x);
        local_478 = ZEXT416((uint)((float)(int)(pIVar13->Ascent + 0.5) + (pIVar91->GlyphOffset).y));
        fVar99 = 1.0 / pIVar91->RasterizerDensity;
        lVar66 = 0;
        lVar73 = 0;
        do {
          lVar80 = *(long *)((long)pvVar61 + uVar136 + 0xd0);
          fVar111 = 1.0 / (float)atlas->TexHeight;
          fVar100 = 1.0 / (float)atlas->TexWidth;
          ImFont::AddGlyph(pIVar13,pIVar91,
                           *(ImWchar *)(*(long *)((long)pvVar61 + uVar136 + 0x108) + lVar73 * 4),
                           (*(float *)(lVar80 + 8 + lVar66) + 0.0) * fVar99 + (float)local_4a8,
                           (*(float *)(lVar80 + 0xc + lVar66) + 0.0) * fVar99 + local_478._0_4_,
                           (*(float *)(lVar80 + 0x14 + lVar66) + 0.0) * fVar99 + (float)local_4a8,
                           (*(float *)(lVar80 + 0x18 + lVar66) + 0.0) * fVar99 + local_478._0_4_,
                           (float)*(ushort *)(lVar80 + lVar66) * fVar100,
                           (float)*(ushort *)(lVar80 + 2 + lVar66) * fVar111,
                           (float)*(ushort *)(lVar80 + 4 + lVar66) * fVar100,
                           (float)*(ushort *)(lVar80 + 6 + lVar66) * fVar111,
                           *(float *)(lVar80 + 0x10 + lVar66) * fVar99);
          lVar73 = lVar73 + 1;
          lVar66 = lVar66 + 0x1c;
        } while (lVar73 < *(int *)((long)pvVar61 + uVar136 + 0xe8));
      }
      lVar90 = lVar90 + 1;
      pvVar61 = __dest;
    } while (lVar90 < iVar178);
    if (0 < iVar178) {
      lVar90 = 0x108;
      lVar73 = 0;
      do {
        __dest = pvVar61;
        if (*(void **)((long)pvVar61 + lVar90) != (void *)0x0) {
          ImGui::MemFree(*(void **)((long)pvVar61 + lVar90));
        }
        pvVar61 = *(void **)((long)pvVar61 + lVar90 + -0x10);
        if (pvVar61 != (void *)0x0) {
          ImGui::MemFree(pvVar61);
        }
        lVar73 = lVar73 + 1;
        lVar90 = lVar90 + 0x110;
        pvVar61 = __dest;
      } while (lVar73 < iVar178);
    }
  }
  if (__dest != (void *)0x0) {
    ImGui::MemFree(__dest);
    __dest = (void *)0x0;
  }
  ImFontAtlasBuildFinish(atlas);
  if (pvStack_420 != (void *)0x0) {
    ImGui::MemFree(pvStack_420);
  }
  if ((void *)local_458._8_8_ != (void *)0x0) {
    ImGui::MemFree((void *)local_458._8_8_);
  }
LAB_001a8ee6:
  bVar98 = (byte)((uint)iVar177 >> 0x18);
  if (pvStack_440 != (void *)0x0) {
    ImGui::MemFree(pvStack_440);
  }
  if (__dest != (void *)0x0) {
    ImGui::MemFree(__dest);
  }
  return (bool)(bVar98 & 1);
}

Assistant:

static bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildInit(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        if (src_tmp.DstIndex == -1)
        {
            IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
            return false;
        }
        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
        {
            IM_ASSERT(0 && "stbtt_InitFont(): failed to parse FontData. It is correct and complete? Check FontDataSize.");
            return false;
        }

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
        {
            // Check for valid range. This may also help detect *some* dangling pointers, because a common
            // user error is to setup ImFontConfig::GlyphRanges with a pointer to data that isn't persistent.
            IM_ASSERT(src_range[0] <= src_range[1]);
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        }
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.GlyphsSet.Create(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Create(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (unsigned int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (dst_tmp.GlyphsSet.TestBit(codepoint))    // Don't overwrite existing glyphs. We could make this an option for MergeMode (e.g. MergeOverwrite==true)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;

                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint);
                dst_tmp.GlyphsSet.SetBit(codepoint);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBitVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels * cfg.RasterizerDensity;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0.0f) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels * cfg.RasterizerDensity) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels * cfg.RasterizerDensity);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096 * 0.7f) ? 4096 : (surface_sqrt >= 2048 * 0.7f) ? 2048 : (surface_sqrt >= 1024 * 0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)IM_ALLOC(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        // When merging fonts with MergeMode=true:
        // - We can have multiple input fonts writing into a same destination font.
        // - dst_font->ConfigData is != from cfg which is our source configuration.
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont;

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImCeil(unscaled_ascent * font_scale);
        const float descent = ImFloor(unscaled_descent * font_scale);
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + IM_ROUND(dst_font->Ascent);

        const float inv_rasterization_scale = 1.0f / cfg.RasterizerDensity;

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            // Register glyph
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];
            stbtt_aligned_quad q;
            float unused_x = 0.0f, unused_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &unused_x, &unused_y, &q, 0);
            float x0 = q.x0 * inv_rasterization_scale + font_off_x;
            float y0 = q.y0 * inv_rasterization_scale + font_off_y;
            float x1 = q.x1 * inv_rasterization_scale + font_off_x;
            float y1 = q.y1 * inv_rasterization_scale + font_off_y;
            dst_font->AddGlyph(&cfg, (ImWchar)codepoint, x0, y0, x1, y1, q.s0, q.t0, q.s1, q.t1, pc.xadvance * inv_rasterization_scale);
        }
    }

    // Cleanup
    src_tmp_array.clear_destruct();

    ImFontAtlasBuildFinish(atlas);
    return true;
}